

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ess_test.cc
# Opt level: O3

int main(void)

{
  pointer pcVar1;
  EssDescribeScheduledTasksRequestType *this;
  HttpTestListener *pHVar2;
  undefined8 extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  EssDeleteScalingConfigurationResponseType resp_5;
  EssAttachInstancesResponseType resp;
  EssAttachInstancesRequestType req;
  long *local_958;
  undefined8 local_950;
  long local_948;
  ushort local_940;
  undefined7 *local_938;
  undefined8 local_930;
  undefined7 local_928;
  undefined1 uStack_921;
  undefined1 uStack_920;
  undefined2 uStack_91f;
  undefined1 local_91d;
  string local_918;
  string local_8f8;
  string local_8d8;
  undefined1 local_8b8 [16];
  undefined1 local_8a8 [24];
  _Alloc_hider local_890;
  undefined1 local_888;
  undefined7 uStack_887;
  undefined1 local_870 [32];
  _Alloc_hider local_850;
  size_type local_848;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_840;
  _Alloc_hider local_830;
  size_type local_828;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_820;
  _Alloc_hider local_810;
  size_type local_808;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_800;
  _Alloc_hider local_7f0;
  size_type local_7e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7e0;
  _Alloc_hider local_7d0;
  size_type local_7c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7c0;
  _Alloc_hider local_7b0;
  _Alloc_hider local_7a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7a0;
  string local_790 [8];
  _Alloc_hider local_788;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_780;
  string local_770 [8];
  _Alloc_hider local_768;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_760;
  string local_750 [8];
  size_type local_748;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_740;
  _Alloc_hider local_730;
  size_type local_728;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_720;
  _Alloc_hider local_710;
  size_type local_708;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_700;
  _Alloc_hider local_6f0;
  size_type local_6e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6e0;
  _Alloc_hider local_6d0;
  size_type local_6c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6c0;
  _Alloc_hider local_6b0;
  size_type local_6a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6a0;
  _Alloc_hider local_690;
  size_type local_688;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_680;
  _Alloc_hider local_670;
  size_type local_668;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_660;
  _Alloc_hider local_650;
  size_type local_648;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_640;
  _Alloc_hider local_630;
  size_type local_628;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_620;
  _Alloc_hider local_610;
  size_type local_608;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_600;
  _Alloc_hider local_5f0;
  size_type local_5e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5e0;
  _Alloc_hider local_5d0;
  size_type local_5c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5c0;
  _Alloc_hider local_5b0;
  size_type local_5a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5a0;
  _Alloc_hider local_590;
  size_type local_588;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_580;
  _Alloc_hider local_570;
  size_type local_568;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_560;
  _Alloc_hider local_550;
  size_type local_548;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_540;
  _Alloc_hider local_530;
  size_type local_528;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_520;
  _Alloc_hider local_510;
  size_type local_508;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_500;
  _Alloc_hider local_4f0;
  size_type local_4e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4e0;
  _Alloc_hider local_4d0;
  size_type local_4c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c0;
  _Alloc_hider local_4b0;
  size_type local_4a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a0;
  _Alloc_hider local_490;
  size_type local_488;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_480;
  _Alloc_hider local_470;
  size_type local_468;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_460;
  _Alloc_hider local_450;
  size_type local_448;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_440;
  _Alloc_hider local_430;
  size_type local_428;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_420;
  _Alloc_hider local_410;
  size_type local_408;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_400;
  _Alloc_hider local_3f0;
  size_type local_3e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e0;
  _Alloc_hider local_3d0;
  size_type local_3c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c0;
  _Alloc_hider local_3b0;
  size_type local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0;
  _Alloc_hider local_390;
  size_type local_388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_380;
  _Alloc_hider local_370;
  size_type local_368;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_360;
  _Alloc_hider local_350;
  size_type local_348;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340;
  _Alloc_hider local_330;
  size_type local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  _Alloc_hider local_310;
  size_type local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  _Alloc_hider local_2f0;
  size_type local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  _Alloc_hider local_2d0;
  size_type local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  _Alloc_hider local_2b0;
  size_type local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  _Alloc_hider local_290;
  size_type local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  _Alloc_hider local_270;
  size_type local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  _Alloc_hider local_250;
  size_type local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  _Alloc_hider local_230;
  size_type local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  _Alloc_hider local_210;
  size_type local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  _Alloc_hider local_1f0;
  size_type local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  _Alloc_hider local_1d0;
  size_type local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  _Alloc_hider local_1b0;
  size_type local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  size_type local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  _Alloc_hider local_170;
  size_type local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  _Alloc_hider local_150;
  size_type local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  _Alloc_hider local_130;
  size_type local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  _Alloc_hider local_110;
  size_type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  _Alloc_hider local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  _Alloc_hider local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  _Alloc_hider local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  _Alloc_hider local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  pcVar1 = local_870 + 0x10;
  local_870._8_8_ = (pointer)0x0;
  local_870[0x10] = '\0';
  local_850._M_p = (pointer)&local_840;
  local_848 = 0;
  local_840._M_local_buf[0] = '\0';
  local_830._M_p = (pointer)&local_820;
  local_828 = 0;
  local_820._M_local_buf[0] = '\0';
  local_810._M_p = (pointer)&local_800;
  local_808 = 0;
  local_800._M_local_buf[0] = '\0';
  local_7f0._M_p = (pointer)&local_7e0;
  local_7e8 = 0;
  local_7e0._M_local_buf[0] = '\0';
  local_7d0._M_p = (pointer)&local_7c0;
  local_7c8 = 0;
  local_7c0._M_local_buf[0] = '\0';
  local_7b0._M_p = (pointer)&local_7a0;
  local_7a8._M_p = (pointer)0x0;
  local_7a0._M_local_buf[0] = '\0';
  local_790 = (string  [8])&local_780;
  local_788._M_p = (pointer)0x0;
  local_780._M_local_buf[0] = '\0';
  local_770 = (string  [8])&local_760;
  local_768._M_p = (pointer)0x0;
  local_760._M_local_buf[0] = '\0';
  local_750 = (string  [8])&local_740;
  local_748 = 0;
  local_740._M_local_buf[0] = '\0';
  local_730._M_p = (pointer)&local_720;
  local_728 = 0;
  local_720._M_local_buf[0] = '\0';
  local_710._M_p = (pointer)&local_700;
  local_708 = 0;
  local_700._M_local_buf[0] = '\0';
  local_6f0._M_p = (pointer)&local_6e0;
  local_6e8 = 0;
  local_6e0._M_local_buf[0] = '\0';
  local_6d0._M_p = (pointer)&local_6c0;
  local_6c8 = 0;
  local_6c0._M_local_buf[0] = '\0';
  local_6b0._M_p = (pointer)&local_6a0;
  local_6a8 = 0;
  local_6a0._M_local_buf[0] = '\0';
  local_690._M_p = (pointer)&local_680;
  local_688 = 0;
  local_680._M_local_buf[0] = '\0';
  local_670._M_p = (pointer)&local_660;
  local_668 = 0;
  local_660._M_local_buf[0] = '\0';
  local_650._M_p = (pointer)&local_640;
  local_648 = 0;
  local_640._M_local_buf[0] = '\0';
  local_630._M_p = (pointer)&local_620;
  local_628 = 0;
  local_620._M_local_buf[0] = '\0';
  local_610._M_p = (pointer)&local_600;
  local_608 = 0;
  local_600._M_local_buf[0] = '\0';
  local_5f0._M_p = (pointer)&local_5e0;
  local_5e8 = 0;
  local_5e0._M_local_buf[0] = '\0';
  local_5d0._M_p = (pointer)&local_5c0;
  local_5c8 = 0;
  local_5c0._M_local_buf[0] = '\0';
  local_5b0._M_p = (pointer)&local_5a0;
  local_5a8 = 0;
  local_5a0._M_local_buf[0] = '\0';
  local_590._M_p = (pointer)&local_580;
  local_588 = 0;
  local_580._M_local_buf[0] = '\0';
  local_570._M_p = (pointer)&local_560;
  local_568 = 0;
  local_560._M_local_buf[0] = '\0';
  local_8b8._8_8_ = (pointer)0x0;
  local_8a8[0] = (vector<aliyun::EssDescribeScalingConfigurationsDataDiskType,_std::allocator<aliyun::EssDescribeScalingConfigurationsDataDiskType>_>
                  )0x0;
  local_928 = 0x676e61682d6e63;
  uStack_921 = 0x7a;
  uStack_920 = 0x68;
  uStack_91f = 0x756f;
  local_930 = 0xb;
  local_91d = 0;
  local_948 = 0x64697070615f796d;
  local_950 = 8;
  local_940 = local_940 & 0xff00;
  paVar3 = &local_8d8.field_2;
  local_8d8.field_2._M_allocated_capacity._0_7_ = 0x726365735f796d;
  local_8d8.field_2._M_local_buf[7] = 'e';
  local_8d8.field_2._M_local_buf[8] = 't';
  local_8d8._M_string_length = 9;
  local_8d8.field_2._M_local_buf[9] = '\0';
  local_958 = &local_948;
  local_938 = &local_928;
  local_8d8._M_dataplus._M_p = (pointer)paVar3;
  local_8b8._0_8_ = (pointer)local_8a8;
  local_870._0_8_ = pcVar1;
  this = (EssDescribeScheduledTasksRequestType *)
         aliyun::Ess::CreateEssClient(&local_938,&local_958,&local_8d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d8._M_dataplus._M_p != paVar3) {
    operator_delete(local_8d8._M_dataplus._M_p,
                    CONCAT17(local_8d8.field_2._M_local_buf[7],
                             local_8d8.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if (local_958 != &local_948) {
    operator_delete(local_958,local_948 + 1);
  }
  if (local_938 != &local_928) {
    operator_delete(local_938,CONCAT17(uStack_921,local_928) + 1);
  }
  if (this == (EssDescribeScheduledTasksRequestType *)0x0) {
    if ((pointer)local_8b8._0_8_ != (pointer)local_8a8) {
      operator_delete((void *)local_8b8._0_8_,
                      CONCAT17(local_8a8[7],CONCAT61(local_8a8._1_6_,local_8a8[0])) + 1);
    }
    aliyun::EssAttachInstancesRequestType::~EssAttachInstancesRequestType
              ((EssAttachInstancesRequestType *)local_870);
    local_870._8_8_ = (pointer)0x0;
    local_870[0x10] = '\0';
    local_850._M_p = (pointer)&local_840;
    local_848 = 0;
    local_840._M_local_buf[0] = '\0';
    local_830._M_p = (pointer)&local_820;
    local_828 = 0;
    local_820._M_local_buf[0] = '\0';
    local_810._M_p = (pointer)&local_800;
    local_808 = 0;
    local_800._M_local_buf[0] = '\0';
    local_7f0._M_p = (pointer)&local_7e0;
    local_7e8 = 0;
    local_7e0._M_local_buf[0] = '\0';
    local_7d0._M_p = (pointer)&local_7c0;
    local_7c8 = 0;
    local_7c0._M_local_buf[0] = '\0';
    local_7b0._M_p = (pointer)&local_7a0;
    local_7a8._M_p = (pointer)0x0;
    local_7a0._M_local_buf[0] = '\0';
    local_790 = (string  [8])&local_780;
    local_788._M_p = (pointer)0x0;
    local_780._M_local_buf[0] = '\0';
    local_770 = (string  [8])&local_760;
    local_768._M_p = (pointer)0x0;
    local_760._M_local_buf[0] = '\0';
    local_750 = (string  [8])&local_740;
    local_748 = 0;
    local_740._M_local_buf[0] = '\0';
    local_730._M_p = (pointer)&local_720;
    local_728 = 0;
    local_720._M_local_buf[0] = '\0';
    local_710._M_p = (pointer)&local_700;
    local_708 = 0;
    local_700._M_local_buf[0] = '\0';
    local_6f0._M_p = (pointer)&local_6e0;
    local_6e8 = 0;
    local_6e0._M_local_buf[0] = '\0';
    local_6d0._M_p = (pointer)&local_6c0;
    local_6c8 = 0;
    local_6c0._M_local_buf[0] = '\0';
    local_6b0._M_p = (pointer)&local_6a0;
    local_6a8 = 0;
    local_6a0._M_local_buf[0] = '\0';
    local_690._M_p = (pointer)&local_680;
    local_688 = 0;
    local_680._M_local_buf[0] = '\0';
    local_670._M_p = (pointer)&local_660;
    local_668 = 0;
    local_660._M_local_buf[0] = '\0';
    local_650._M_p = (pointer)&local_640;
    local_648 = 0;
    local_640._M_local_buf[0] = '\0';
    local_630._M_p = (pointer)&local_620;
    local_628 = 0;
    local_620._M_local_buf[0] = '\0';
    local_610._M_p = (pointer)&local_600;
    local_608 = 0;
    local_600._M_local_buf[0] = '\0';
    local_5f0._M_p = (pointer)&local_5e0;
    local_5e8 = 0;
    local_5e0._M_local_buf[0] = '\0';
    local_5d0._M_p = (pointer)&local_5c0;
    local_5c8 = 0;
    local_5c0._M_local_buf[0] = '\0';
    local_5b0._M_p = (pointer)&local_5a0;
    local_5a8 = 0;
    local_5a0._M_local_buf[0] = '\0';
    local_590._M_p = (pointer)&local_580;
    local_588 = 0;
    local_580._M_local_buf[0] = '\0';
    local_570._M_p = (pointer)&local_560;
    local_568 = 0;
    local_560._M_local_buf[0] = '\0';
    local_550._M_p = (pointer)&local_540;
    local_548 = 0;
    local_540._M_local_buf[0] = '\0';
    local_530._M_p = (pointer)&local_520;
    local_528 = 0;
    local_520._M_local_buf[0] = '\0';
    local_510._M_p = (pointer)&local_500;
    local_508 = 0;
    local_500._M_local_buf[0] = '\0';
    local_4f0._M_p = (pointer)&local_4e0;
    local_4e8 = 0;
    local_4e0._M_local_buf[0] = '\0';
    local_4d0._M_p = (pointer)&local_4c0;
    local_4c8 = 0;
    local_4c0._M_local_buf[0] = '\0';
    local_4b0._M_p = (pointer)&local_4a0;
    local_4a8 = 0;
    local_4a0._M_local_buf[0] = '\0';
    local_490._M_p = (pointer)&local_480;
    local_488 = 0;
    local_480._M_local_buf[0] = '\0';
    local_470._M_p = (pointer)&local_460;
    local_468 = 0;
    local_460._M_local_buf[0] = '\0';
    local_8b8._8_8_ = (pointer)0x0;
    local_8a8[0] = (vector<aliyun::EssDescribeScalingConfigurationsDataDiskType,_std::allocator<aliyun::EssDescribeScalingConfigurationsDataDiskType>_>
                    )0x0;
    local_928 = 0x676e61682d6e63;
    uStack_921 = 0x7a;
    uStack_920 = 0x68;
    uStack_91f = 0x756f;
    local_930 = 0xb;
    local_91d = 0;
    local_948 = 0x64697070615f796d;
    local_950 = 8;
    local_940 = local_940 & 0xff00;
    local_8d8.field_2._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_8d8.field_2._M_local_buf[7] = 'e';
    local_8d8.field_2._M_local_buf[8] = 't';
    local_8d8._M_string_length = 9;
    local_8d8.field_2._M_local_buf[9] = '\0';
    local_958 = &local_948;
    local_938 = &local_928;
    local_8d8._M_dataplus._M_p = (pointer)paVar3;
    local_8b8._0_8_ = (pointer)local_8a8;
    local_870._0_8_ = pcVar1;
    this = (EssDescribeScheduledTasksRequestType *)aliyun::Ess::CreateEssClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8d8._M_dataplus._M_p != paVar3) {
      operator_delete(local_8d8._M_dataplus._M_p,
                      CONCAT17(local_8d8.field_2._M_local_buf[7],
                               local_8d8.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if (local_958 != &local_948) {
      operator_delete(local_958,local_948 + 1);
    }
    if (local_938 != &local_928) {
      operator_delete(local_938,CONCAT17(uStack_921,local_928) + 1);
    }
    if (this != (EssDescribeScheduledTasksRequestType *)0x0) goto LAB_0010a6f1;
    if ((pointer)local_8b8._0_8_ != (pointer)local_8a8) {
      operator_delete((void *)local_8b8._0_8_,
                      CONCAT17(local_8a8[7],CONCAT61(local_8a8._1_6_,local_8a8[0])) + 1);
    }
    aliyun::EssCreateScalingConfigurationRequestType::~EssCreateScalingConfigurationRequestType
              ((EssCreateScalingConfigurationRequestType *)local_870);
    local_870._8_8_ = (pointer)0x0;
    local_870[0x10] = '\0';
    local_850._M_p = (pointer)&local_840;
    local_848 = 0;
    local_840._M_local_buf[0] = '\0';
    local_830._M_p = (pointer)&local_820;
    local_828 = 0;
    local_820._M_local_buf[0] = '\0';
    local_810._M_p = (pointer)&local_800;
    local_808 = 0;
    local_800._M_local_buf[0] = '\0';
    local_7f0._M_p = (pointer)&local_7e0;
    local_7e8 = 0;
    local_7e0._M_local_buf[0] = '\0';
    local_7d0._M_p = (pointer)&local_7c0;
    local_7c8 = 0;
    local_7c0._M_local_buf[0] = '\0';
    local_7b0._M_p = (pointer)&local_7a0;
    local_7a8._M_p = (pointer)0x0;
    local_7a0._M_local_buf[0] = '\0';
    local_790 = (string  [8])&local_780;
    local_788._M_p = (pointer)0x0;
    local_780._M_local_buf[0] = '\0';
    local_770 = (string  [8])&local_760;
    local_768._M_p = (pointer)0x0;
    local_760._M_local_buf[0] = '\0';
    local_750 = (string  [8])&local_740;
    local_748 = 0;
    local_740._M_local_buf[0] = '\0';
    local_730._M_p = (pointer)&local_720;
    local_728 = 0;
    local_720._M_local_buf[0] = '\0';
    local_710._M_p = (pointer)&local_700;
    local_708 = 0;
    local_700._M_local_buf[0] = '\0';
    local_6f0._M_p = (pointer)&local_6e0;
    local_6e8 = 0;
    local_6e0._M_local_buf[0] = '\0';
    local_6d0._M_p = (pointer)&local_6c0;
    local_6c8 = 0;
    local_6c0._M_local_buf[0] = '\0';
    local_8b8._8_8_ = (pointer)0x0;
    local_8a8[0] = (vector<aliyun::EssDescribeScalingConfigurationsDataDiskType,_std::allocator<aliyun::EssDescribeScalingConfigurationsDataDiskType>_>
                    )0x0;
    local_928 = 0x676e61682d6e63;
    uStack_921 = 0x7a;
    uStack_920 = 0x68;
    uStack_91f = 0x756f;
    local_930 = 0xb;
    local_91d = 0;
    local_948 = 0x64697070615f796d;
    local_950 = 8;
    local_940 = local_940 & 0xff00;
    local_8d8.field_2._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_8d8.field_2._M_local_buf[7] = 'e';
    local_8d8.field_2._M_local_buf[8] = 't';
    local_8d8._M_string_length = 9;
    local_8d8.field_2._M_local_buf[9] = '\0';
    local_958 = &local_948;
    local_938 = &local_928;
    local_8d8._M_dataplus._M_p = (pointer)paVar3;
    local_8b8._0_8_ = (pointer)local_8a8;
    local_870._0_8_ = pcVar1;
    this = (EssDescribeScheduledTasksRequestType *)aliyun::Ess::CreateEssClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8d8._M_dataplus._M_p != paVar3) {
      operator_delete(local_8d8._M_dataplus._M_p,
                      CONCAT17(local_8d8.field_2._M_local_buf[7],
                               local_8d8.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if (local_958 != &local_948) {
      operator_delete(local_958,local_948 + 1);
    }
    if (local_938 != &local_928) {
      operator_delete(local_938,CONCAT17(uStack_921,local_928) + 1);
    }
    if (this != (EssDescribeScheduledTasksRequestType *)0x0) goto LAB_0010aa79;
    if ((pointer)local_8b8._0_8_ != (pointer)local_8a8) {
      operator_delete((void *)local_8b8._0_8_,
                      CONCAT17(local_8a8[7],CONCAT61(local_8a8._1_6_,local_8a8[0])) + 1);
    }
    aliyun::EssCreateScalingGroupRequestType::~EssCreateScalingGroupRequestType
              ((EssCreateScalingGroupRequestType *)local_870);
    local_870._8_8_ = (pointer)0x0;
    local_870[0x10] = '\0';
    local_850._M_p = (pointer)&local_840;
    local_848 = 0;
    local_840._M_local_buf[0] = '\0';
    local_830._M_p = (pointer)&local_820;
    local_828 = 0;
    local_820._M_local_buf[0] = '\0';
    local_810._M_p = (pointer)&local_800;
    local_808 = 0;
    local_800._M_local_buf[0] = '\0';
    local_7f0._M_p = (pointer)&local_7e0;
    local_7e8 = 0;
    local_7e0._M_local_buf[0] = '\0';
    local_7d0._M_p = (pointer)&local_7c0;
    local_7c8 = 0;
    local_7c0._M_local_buf[0] = '\0';
    local_7b0._M_p = (pointer)&local_7a0;
    local_7a8._M_p = (pointer)0x0;
    local_7a0._M_local_buf[0] = '\0';
    local_790 = (string  [8])&local_780;
    local_788._M_p = (pointer)0x0;
    local_780._M_local_buf[0] = '\0';
    local_770 = (string  [8])&local_760;
    local_768._M_p = (pointer)0x0;
    local_760._M_local_buf[0] = '\0';
    local_8b8._8_8_ = (pointer)0x0;
    local_8a8[0] = (vector<aliyun::EssDescribeScalingConfigurationsDataDiskType,_std::allocator<aliyun::EssDescribeScalingConfigurationsDataDiskType>_>
                    )0x0;
    local_890._M_p = (pointer)0x0;
    local_888 = 0;
    local_928 = 0x676e61682d6e63;
    uStack_921 = 0x7a;
    uStack_920 = 0x68;
    uStack_91f = 0x756f;
    local_930 = 0xb;
    local_91d = 0;
    local_948 = 0x64697070615f796d;
    local_950 = 8;
    local_940 = local_940 & 0xff00;
    local_8d8.field_2._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_8d8.field_2._M_local_buf[7] = 'e';
    local_8d8.field_2._M_local_buf[8] = 't';
    local_8d8._M_string_length = 9;
    local_8d8.field_2._M_local_buf[9] = '\0';
    local_958 = &local_948;
    local_938 = &local_928;
    local_8d8._M_dataplus._M_p = (pointer)paVar3;
    local_8b8._0_8_ = (pointer)local_8a8;
    local_8a8._16_8_ = &local_888;
    local_870._0_8_ = pcVar1;
    this = (EssDescribeScheduledTasksRequestType *)aliyun::Ess::CreateEssClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8d8._M_dataplus._M_p != paVar3) {
      operator_delete(local_8d8._M_dataplus._M_p,
                      CONCAT17(local_8d8.field_2._M_local_buf[7],
                               local_8d8.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if (local_958 != &local_948) {
      operator_delete(local_958,local_948 + 1);
    }
    if (local_938 != &local_928) {
      operator_delete(local_938,CONCAT17(uStack_921,local_928) + 1);
    }
    if (this != (EssDescribeScheduledTasksRequestType *)0x0) goto LAB_0010ac85;
    if ((undefined1 *)local_8a8._16_8_ != &local_888) {
      operator_delete((void *)local_8a8._16_8_,CONCAT71(uStack_887,local_888) + 1);
    }
    pcVar1 = local_870 + 0x10;
    if ((pointer)local_8b8._0_8_ != (pointer)local_8a8) {
      operator_delete((void *)local_8b8._0_8_,
                      CONCAT17(local_8a8[7],CONCAT61(local_8a8._1_6_,local_8a8[0])) + 1);
    }
    aliyun::EssCreateScalingRuleRequestType::~EssCreateScalingRuleRequestType
              ((EssCreateScalingRuleRequestType *)local_870);
    local_870._8_8_ = (pointer)0x0;
    local_870[0x10] = '\0';
    local_850._M_p = (pointer)&local_840;
    local_848 = 0;
    local_840._M_local_buf[0] = '\0';
    local_830._M_p = (pointer)&local_820;
    local_828 = 0;
    local_820._M_local_buf[0] = '\0';
    local_810._M_p = (pointer)&local_800;
    local_808 = 0;
    local_800._M_local_buf[0] = '\0';
    local_7f0._M_p = (pointer)&local_7e0;
    local_7e8 = 0;
    local_7e0._M_local_buf[0] = '\0';
    local_7d0._M_p = (pointer)&local_7c0;
    local_7c8 = 0;
    local_7c0._M_local_buf[0] = '\0';
    local_7b0._M_p = (pointer)&local_7a0;
    local_7a8._M_p = (pointer)0x0;
    local_7a0._M_local_buf[0] = '\0';
    local_790 = (string  [8])&local_780;
    local_788._M_p = (pointer)0x0;
    local_780._M_local_buf[0] = '\0';
    local_770 = (string  [8])&local_760;
    local_768._M_p = (pointer)0x0;
    local_760._M_local_buf[0] = '\0';
    local_750 = (string  [8])&local_740;
    local_748 = 0;
    local_740._M_local_buf[0] = '\0';
    local_730._M_p = (pointer)&local_720;
    local_728 = 0;
    local_720._M_local_buf[0] = '\0';
    local_710._M_p = (pointer)&local_700;
    local_708 = 0;
    local_700._M_local_buf[0] = '\0';
    local_6f0._M_p = (pointer)&local_6e0;
    local_6e8 = 0;
    local_6e0._M_local_buf[0] = '\0';
    local_8b8._8_8_ = (pointer)0x0;
    local_8a8[0] = (vector<aliyun::EssDescribeScalingConfigurationsDataDiskType,_std::allocator<aliyun::EssDescribeScalingConfigurationsDataDiskType>_>
                    )0x0;
    local_928 = 0x676e61682d6e63;
    uStack_921 = 0x7a;
    uStack_920 = 0x68;
    uStack_91f = 0x756f;
    local_930 = 0xb;
    local_91d = 0;
    local_948 = 0x64697070615f796d;
    local_950 = 8;
    local_940 = local_940 & 0xff00;
    local_8d8.field_2._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_8d8.field_2._M_local_buf[7] = 'e';
    local_8d8.field_2._M_local_buf[8] = 't';
    local_8d8._M_string_length = 9;
    local_8d8.field_2._M_local_buf[9] = '\0';
    local_958 = &local_948;
    local_938 = &local_928;
    local_8d8._M_dataplus._M_p = (pointer)paVar3;
    local_8b8._0_8_ = (pointer)local_8a8;
    local_870._0_8_ = pcVar1;
    this = (EssDescribeScheduledTasksRequestType *)aliyun::Ess::CreateEssClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8d8._M_dataplus._M_p != paVar3) {
      operator_delete(local_8d8._M_dataplus._M_p,
                      CONCAT17(local_8d8.field_2._M_local_buf[7],
                               local_8d8.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if (local_958 != &local_948) {
      operator_delete(local_958,local_948 + 1);
    }
    if (local_938 != &local_928) {
      operator_delete(local_938,CONCAT17(uStack_921,local_928) + 1);
    }
    if (this != (EssDescribeScheduledTasksRequestType *)0x0) goto LAB_0010ae2d;
    if ((pointer)local_8b8._0_8_ != (pointer)local_8a8) {
      operator_delete((void *)local_8b8._0_8_,
                      CONCAT17(local_8a8[7],CONCAT61(local_8a8._1_6_,local_8a8[0])) + 1);
    }
    aliyun::EssCreateScheduledTaskRequestType::~EssCreateScheduledTaskRequestType
              ((EssCreateScheduledTaskRequestType *)local_870);
    local_870._8_8_ = (pointer)0x0;
    local_870[0x10] = '\0';
    local_850._M_p = (pointer)&local_840;
    local_848 = 0;
    local_840._M_local_buf[0] = '\0';
    local_830._M_p = (pointer)&local_820;
    local_828 = 0;
    local_820._M_local_buf[0] = '\0';
    local_810._M_p = (pointer)&local_800;
    local_808 = 0;
    local_800._M_local_buf[0] = '\0';
    local_7f0._M_p = (pointer)&local_7e0;
    local_7e8 = 0;
    local_7e0._M_local_buf[0] = '\0';
    local_8a8[0] = (vector<aliyun::EssDescribeScalingConfigurationsDataDiskType,_std::allocator<aliyun::EssDescribeScalingConfigurationsDataDiskType>_>
                    )0x63;
    local_8a8._1_6_ = 0x676e61682d6e;
    local_8a8._7_4_ = 0x756f687a;
    local_8b8._8_8_ = (pointer)0xb;
    local_8a8[0xb] = 0;
    local_928 = 0x697070615f796d;
    uStack_921 = 100;
    local_930 = 8;
    uStack_920 = 0;
    local_948 = 0x65726365735f796d;
    local_950 = 9;
    local_940 = 0x74;
    local_958 = &local_948;
    local_938 = &local_928;
    local_8b8._0_8_ = (pointer)local_8a8;
    local_870._0_8_ = pcVar1;
    this = (EssDescribeScheduledTasksRequestType *)aliyun::Ess::CreateEssClient();
    if (local_958 != &local_948) {
      operator_delete(local_958,local_948 + 1);
    }
    if (local_938 != &local_928) {
      operator_delete(local_938,CONCAT17(uStack_921,local_928) + 1);
    }
    if ((pointer)local_8b8._0_8_ != (pointer)local_8a8) {
      operator_delete((void *)local_8b8._0_8_,
                      CONCAT17(local_8a8[7],CONCAT61(local_8a8._1_6_,local_8a8[0])) + 1);
    }
    if (this != (EssDescribeScheduledTasksRequestType *)0x0) goto LAB_0010b025;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7f0._M_p != &local_7e0) {
      operator_delete(local_7f0._M_p,
                      CONCAT71(local_7e0._M_allocated_capacity._1_7_,local_7e0._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_810._M_p != &local_800) {
      operator_delete(local_810._M_p,
                      CONCAT71(local_800._M_allocated_capacity._1_7_,local_800._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_830._M_p != &local_820) {
      operator_delete(local_830._M_p,
                      CONCAT71(local_820._M_allocated_capacity._1_7_,local_820._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_850._M_p != &local_840) {
      operator_delete(local_850._M_p,
                      CONCAT71(local_840._M_allocated_capacity._1_7_,local_840._M_local_buf[0]) + 1)
      ;
    }
    if ((pointer)local_870._0_8_ != pcVar1) {
      operator_delete((void *)local_870._0_8_,CONCAT71(local_870._17_7_,local_870[0x10]) + 1);
    }
    local_870._8_8_ = (pointer)0x0;
    local_870[0x10] = '\0';
    local_850._M_p = (pointer)&local_840;
    local_848 = 0;
    local_840._M_local_buf[0] = '\0';
    local_830._M_p = (pointer)&local_820;
    local_828 = 0;
    local_820._M_local_buf[0] = '\0';
    local_810._M_p = (pointer)&local_800;
    local_808 = 0;
    local_800._M_local_buf[0] = '\0';
    local_7f0._M_p = (pointer)&local_7e0;
    local_7e8 = 0;
    local_7e0._M_local_buf[0] = '\0';
    local_7d0._M_p = (pointer)&local_7c0;
    local_7c8 = 0;
    local_7c0._M_local_buf[0] = '\0';
    local_8a8[0] = (vector<aliyun::EssDescribeScalingConfigurationsDataDiskType,_std::allocator<aliyun::EssDescribeScalingConfigurationsDataDiskType>_>
                    )0x63;
    local_8a8._1_6_ = 0x676e61682d6e;
    local_8a8._7_4_ = 0x756f687a;
    local_8b8._8_8_ = (pointer)0xb;
    local_8a8[0xb] = 0;
    local_928 = 0x697070615f796d;
    uStack_921 = 100;
    local_930 = 8;
    uStack_920 = 0;
    local_948 = 0x65726365735f796d;
    local_940 = 0x74;
    local_950 = 9;
    local_958 = &local_948;
    local_938 = &local_928;
    local_8b8._0_8_ = (pointer)local_8a8;
    local_870._0_8_ = pcVar1;
    this = (EssDescribeScheduledTasksRequestType *)aliyun::Ess::CreateEssClient();
    if (local_958 != &local_948) {
      operator_delete(local_958,local_948 + 1);
    }
    if (local_938 != &local_928) {
      operator_delete(local_938,CONCAT17(uStack_921,local_928) + 1);
    }
    if ((pointer)local_8b8._0_8_ != (pointer)local_8a8) {
      operator_delete((void *)local_8b8._0_8_,
                      CONCAT17(local_8a8[7],CONCAT61(local_8a8._1_6_,local_8a8[0])) + 1);
    }
    if (this != (EssDescribeScheduledTasksRequestType *)0x0) goto LAB_0010b176;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7d0._M_p != &local_7c0) {
      operator_delete(local_7d0._M_p,
                      CONCAT71(local_7c0._M_allocated_capacity._1_7_,local_7c0._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7f0._M_p != &local_7e0) {
      operator_delete(local_7f0._M_p,
                      CONCAT71(local_7e0._M_allocated_capacity._1_7_,local_7e0._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_810._M_p != &local_800) {
      operator_delete(local_810._M_p,
                      CONCAT71(local_800._M_allocated_capacity._1_7_,local_800._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_830._M_p != &local_820) {
      operator_delete(local_830._M_p,
                      CONCAT71(local_820._M_allocated_capacity._1_7_,local_820._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_850._M_p != &local_840) {
      operator_delete(local_850._M_p,
                      CONCAT71(local_840._M_allocated_capacity._1_7_,local_840._M_local_buf[0]) + 1)
      ;
    }
    if ((pointer)local_870._0_8_ != pcVar1) {
      operator_delete((void *)local_870._0_8_,CONCAT71(local_870._17_7_,local_870[0x10]) + 1);
    }
    local_870._8_8_ = (pointer)0x0;
    local_870[0x10] = '\0';
    local_850._M_p = (pointer)&local_840;
    local_848 = 0;
    local_840._M_local_buf[0] = '\0';
    local_830._M_p = (pointer)&local_820;
    local_828 = 0;
    local_820._M_local_buf[0] = '\0';
    local_810._M_p = (pointer)&local_800;
    local_808 = 0;
    local_800._M_local_buf[0] = '\0';
    local_7f0._M_p = (pointer)&local_7e0;
    local_7e8 = 0;
    local_7e0._M_local_buf[0] = '\0';
    local_8a8[0] = (vector<aliyun::EssDescribeScalingConfigurationsDataDiskType,_std::allocator<aliyun::EssDescribeScalingConfigurationsDataDiskType>_>
                    )0x63;
    local_8a8._1_6_ = 0x676e61682d6e;
    local_8a8._7_4_ = 0x756f687a;
    local_8b8._8_8_ = (pointer)0xb;
    local_8a8[0xb] = 0;
    local_928 = 0x697070615f796d;
    uStack_921 = 100;
    local_930 = 8;
    uStack_920 = 0;
    local_948 = 0x65726365735f796d;
    local_950 = 9;
    local_940 = 0x74;
    local_958 = &local_948;
    local_938 = &local_928;
    local_8b8._0_8_ = (pointer)local_8a8;
    local_870._0_8_ = pcVar1;
    this = (EssDescribeScheduledTasksRequestType *)aliyun::Ess::CreateEssClient();
    if (local_958 != &local_948) {
      operator_delete(local_958,local_948 + 1);
    }
    if (local_938 != &local_928) {
      operator_delete(local_938,CONCAT17(uStack_921,local_928) + 1);
    }
    if ((pointer)local_8b8._0_8_ != (pointer)local_8a8) {
      operator_delete((void *)local_8b8._0_8_,
                      CONCAT17(local_8a8[7],CONCAT61(local_8a8._1_6_,local_8a8[0])) + 1);
    }
    if (this != (EssDescribeScheduledTasksRequestType *)0x0) goto LAB_0010b2db;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7f0._M_p != &local_7e0) {
      operator_delete(local_7f0._M_p,
                      CONCAT71(local_7e0._M_allocated_capacity._1_7_,local_7e0._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_810._M_p != &local_800) {
      operator_delete(local_810._M_p,
                      CONCAT71(local_800._M_allocated_capacity._1_7_,local_800._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_830._M_p != &local_820) {
      operator_delete(local_830._M_p,
                      CONCAT71(local_820._M_allocated_capacity._1_7_,local_820._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_850._M_p != &local_840) {
      operator_delete(local_850._M_p,
                      CONCAT71(local_840._M_allocated_capacity._1_7_,local_840._M_local_buf[0]) + 1)
      ;
    }
    if ((pointer)local_870._0_8_ != pcVar1) {
      operator_delete((void *)local_870._0_8_,CONCAT71(local_870._17_7_,local_870[0x10]) + 1);
    }
    local_870._8_8_ = (pointer)0x0;
    local_870[0x10] = '\0';
    local_850._M_p = (pointer)&local_840;
    local_848 = 0;
    local_840._M_local_buf[0] = '\0';
    local_830._M_p = (pointer)&local_820;
    local_828 = 0;
    local_820._M_local_buf[0] = '\0';
    local_810._M_p = (pointer)&local_800;
    local_808 = 0;
    local_800._M_local_buf[0] = '\0';
    local_7f0._M_p = (pointer)&local_7e0;
    local_7e8 = 0;
    local_7e0._M_local_buf[0] = '\0';
    local_8a8[0] = (vector<aliyun::EssDescribeScalingConfigurationsDataDiskType,_std::allocator<aliyun::EssDescribeScalingConfigurationsDataDiskType>_>
                    )0x63;
    local_8a8._1_6_ = 0x676e61682d6e;
    local_8a8._7_4_ = 0x756f687a;
    local_8b8._8_8_ = (pointer)0xb;
    local_8a8[0xb] = 0;
    local_928 = 0x697070615f796d;
    uStack_921 = 100;
    local_930 = 8;
    uStack_920 = 0;
    local_948 = 0x65726365735f796d;
    local_950 = 9;
    local_940 = 0x74;
    local_958 = &local_948;
    local_938 = &local_928;
    local_8b8._0_8_ = (pointer)local_8a8;
    local_870._0_8_ = pcVar1;
    this = (EssDescribeScheduledTasksRequestType *)aliyun::Ess::CreateEssClient();
    if (local_958 != &local_948) {
      operator_delete(local_958,local_948 + 1);
    }
    if (local_938 != &local_928) {
      operator_delete(local_938,CONCAT17(uStack_921,local_928) + 1);
    }
    if ((pointer)local_8b8._0_8_ != (pointer)local_8a8) {
      operator_delete((void *)local_8b8._0_8_,
                      CONCAT17(local_8a8[7],CONCAT61(local_8a8._1_6_,local_8a8[0])) + 1);
    }
    if (this != (EssDescribeScheduledTasksRequestType *)0x0) goto LAB_0010b42c;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7f0._M_p != &local_7e0) {
      operator_delete(local_7f0._M_p,
                      CONCAT71(local_7e0._M_allocated_capacity._1_7_,local_7e0._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_810._M_p != &local_800) {
      operator_delete(local_810._M_p,
                      CONCAT71(local_800._M_allocated_capacity._1_7_,local_800._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_830._M_p != &local_820) {
      operator_delete(local_830._M_p,
                      CONCAT71(local_820._M_allocated_capacity._1_7_,local_820._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_850._M_p != &local_840) {
      operator_delete(local_850._M_p,
                      CONCAT71(local_840._M_allocated_capacity._1_7_,local_840._M_local_buf[0]) + 1)
      ;
    }
    if ((pointer)local_870._0_8_ != pcVar1) {
      operator_delete((void *)local_870._0_8_,CONCAT71(local_870._17_7_,local_870[0x10]) + 1);
    }
    local_870._8_8_ = (pointer)0x0;
    local_870[0x10] = '\0';
    local_850._M_p = (pointer)&local_840;
    local_848 = 0;
    local_840._M_local_buf[0] = '\0';
    local_830._M_p = (pointer)&local_820;
    local_828 = 0;
    local_820._M_local_buf[0] = '\0';
    local_810._M_p = (pointer)&local_800;
    local_808 = 0;
    local_800._M_local_buf[0] = '\0';
    local_7f0._M_p = (pointer)&local_7e0;
    local_7e8 = 0;
    local_7e0._M_local_buf[0] = '\0';
    local_7d0._M_p = (pointer)&local_7c0;
    local_7c8 = 0;
    local_7c0._M_local_buf[0] = '\0';
    local_7b0._M_p = (pointer)&local_7a0;
    local_7a8._M_p = (pointer)0x0;
    local_7a0._M_local_buf[0] = '\0';
    local_790 = (string  [8])&local_780;
    local_788._M_p = (pointer)0x0;
    local_780._M_local_buf[0] = '\0';
    local_770 = (string  [8])&local_760;
    local_768._M_p = (pointer)0x0;
    local_760._M_local_buf[0] = '\0';
    local_750 = (string  [8])&local_740;
    local_748 = 0;
    local_740._M_local_buf[0] = '\0';
    local_730._M_p = (pointer)&local_720;
    local_728 = 0;
    local_720._M_local_buf[0] = '\0';
    local_710._M_p = (pointer)&local_700;
    local_708 = 0;
    local_700._M_local_buf[0] = '\0';
    local_6f0._M_p = (pointer)&local_6e0;
    local_6e8 = 0;
    local_6e0._M_local_buf[0] = '\0';
    local_6d0._M_p = (pointer)&local_6c0;
    local_6c8 = 0;
    local_6c0._M_local_buf[0] = '\0';
    local_6b0._M_p = (pointer)&local_6a0;
    local_6a8 = 0;
    local_6a0._M_local_buf[0] = '\0';
    local_690._M_p = (pointer)&local_680;
    local_688 = 0;
    local_680._M_local_buf[0] = '\0';
    local_670._M_p = (pointer)&local_660;
    local_668 = 0;
    local_660._M_local_buf[0] = '\0';
    local_650._M_p = (pointer)&local_640;
    local_648 = 0;
    local_640._M_local_buf[0] = '\0';
    local_630._M_p = (pointer)&local_620;
    local_628 = 0;
    local_620._M_local_buf[0] = '\0';
    local_610._M_p = (pointer)&local_600;
    local_608 = 0;
    local_600._M_local_buf[0] = '\0';
    local_5f0._M_p = (pointer)&local_5e0;
    local_5e8 = 0;
    local_5e0._M_local_buf[0] = '\0';
    local_5d0._M_p = (pointer)&local_5c0;
    local_5c8 = 0;
    local_5c0._M_local_buf[0] = '\0';
    local_5b0._M_p = (pointer)&local_5a0;
    local_5a8 = 0;
    local_5a0._M_local_buf[0] = '\0';
    local_590._M_p = (pointer)&local_580;
    local_588 = 0;
    local_580._M_local_buf[0] = '\0';
    local_570._M_p = (pointer)&local_560;
    local_568 = 0;
    local_560._M_local_buf[0] = '\0';
    local_550._M_p = (pointer)&local_540;
    local_548 = 0;
    local_540._M_local_buf[0] = '\0';
    local_530._M_p = (pointer)&local_520;
    local_528 = 0;
    local_520._M_local_buf[0] = '\0';
    local_510._M_p = (pointer)&local_500;
    local_508 = 0;
    local_500._M_local_buf[0] = '\0';
    local_8a8[0] = (vector<aliyun::EssDescribeScalingConfigurationsDataDiskType,_std::allocator<aliyun::EssDescribeScalingConfigurationsDataDiskType>_>
                    )0x0;
    local_8a8._1_6_ = 0;
    local_8a8._7_4_ = local_8a8._7_4_ & 0xffffff00;
    local_928 = 0x676e61682d6e63;
    uStack_921 = 0x7a;
    uStack_920 = 0x68;
    uStack_91f = 0x756f;
    local_930 = 0xb;
    local_91d = 0;
    local_948 = 0x64697070615f796d;
    local_950 = 8;
    local_940 = local_940 & 0xff00;
    local_8d8.field_2._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_8d8.field_2._M_local_buf[7] = 'e';
    local_8d8.field_2._M_local_buf[8] = 't';
    local_8d8._M_string_length = 9;
    local_8d8.field_2._M_local_buf[9] = '\0';
    local_8b8._0_8_ = (pointer)0x0;
    local_8b8._8_8_ = (pointer)0x0;
    local_958 = &local_948;
    local_938 = &local_928;
    local_8d8._M_dataplus._M_p = (pointer)paVar3;
    local_870._0_8_ = pcVar1;
    this = (EssDescribeScheduledTasksRequestType *)aliyun::Ess::CreateEssClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8d8._M_dataplus._M_p != paVar3) {
      operator_delete(local_8d8._M_dataplus._M_p,
                      CONCAT17(local_8d8.field_2._M_local_buf[7],
                               local_8d8.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if (local_958 != &local_948) {
      operator_delete(local_958,local_948 + 1);
    }
    if (local_938 != &local_928) {
      operator_delete(local_938,CONCAT17(uStack_921,local_928) + 1);
    }
    if (this != (EssDescribeScheduledTasksRequestType *)0x0) goto LAB_0010b57d;
    std::
    vector<aliyun::EssDescribeScalingActivitiesScalingActivityType,_std::allocator<aliyun::EssDescribeScalingActivitiesScalingActivityType>_>
    ::~vector((vector<aliyun::EssDescribeScalingActivitiesScalingActivityType,_std::allocator<aliyun::EssDescribeScalingActivitiesScalingActivityType>_>
               *)local_8b8);
    aliyun::EssDescribeScalingActivitiesRequestType::~EssDescribeScalingActivitiesRequestType
              ((EssDescribeScalingActivitiesRequestType *)local_870);
    local_870._0_8_ = local_870 + 0x10;
    local_870._8_8_ = (pointer)0x0;
    local_870[0x10] = '\0';
    local_850._M_p = (pointer)&local_840;
    local_848 = 0;
    local_840._M_local_buf[0] = '\0';
    local_830._M_p = (pointer)&local_820;
    local_828 = 0;
    local_820._M_local_buf[0] = '\0';
    local_810._M_p = (pointer)&local_800;
    local_808 = 0;
    local_800._M_local_buf[0] = '\0';
    local_7f0._M_p = (pointer)&local_7e0;
    local_7e8 = 0;
    local_7e0._M_local_buf[0] = '\0';
    local_7d0._M_p = (pointer)&local_7c0;
    local_7c8 = 0;
    local_7c0._M_local_buf[0] = '\0';
    local_7b0._M_p = (pointer)&local_7a0;
    local_7a8._M_p = (pointer)0x0;
    local_7a0._M_local_buf[0] = '\0';
    local_790 = (string  [8])&local_780;
    local_788._M_p = (pointer)0x0;
    local_780._M_local_buf[0] = '\0';
    local_770 = (string  [8])&local_760;
    local_768._M_p = (pointer)0x0;
    local_760._M_local_buf[0] = '\0';
    local_750 = (string  [8])&local_740;
    local_748 = 0;
    local_740._M_local_buf[0] = '\0';
    local_730._M_p = (pointer)&local_720;
    local_728 = 0;
    local_720._M_local_buf[0] = '\0';
    local_710._M_p = (pointer)&local_700;
    local_708 = 0;
    local_700._M_local_buf[0] = '\0';
    local_6f0._M_p = (pointer)&local_6e0;
    local_6e8 = 0;
    local_6e0._M_local_buf[0] = '\0';
    local_6d0._M_p = (pointer)&local_6c0;
    local_6c8 = 0;
    local_6c0._M_local_buf[0] = '\0';
    local_6b0._M_p = (pointer)&local_6a0;
    local_6a8 = 0;
    local_6a0._M_local_buf[0] = '\0';
    local_690._M_p = (pointer)&local_680;
    local_688 = 0;
    local_680._M_local_buf[0] = '\0';
    local_670._M_p = (pointer)&local_660;
    local_668 = 0;
    local_660._M_local_buf[0] = '\0';
    local_650._M_p = (pointer)&local_640;
    local_648 = 0;
    local_640._M_local_buf[0] = '\0';
    local_630._M_p = (pointer)&local_620;
    local_628 = 0;
    local_620._M_local_buf[0] = '\0';
    local_610._M_p = (pointer)&local_600;
    local_608 = 0;
    local_600._M_local_buf[0] = '\0';
    local_5f0._M_p = (pointer)&local_5e0;
    local_5e8 = 0;
    local_5e0._M_local_buf[0] = '\0';
    local_5d0._M_p = (pointer)&local_5c0;
    local_5c8 = 0;
    local_5c0._M_local_buf[0] = '\0';
    local_5b0._M_p = (pointer)&local_5a0;
    local_5a8 = 0;
    local_5a0._M_local_buf[0] = '\0';
    local_590._M_p = (pointer)&local_580;
    local_588 = 0;
    local_580._M_local_buf[0] = '\0';
    local_570._M_p = (pointer)&local_560;
    local_568 = 0;
    local_560._M_local_buf[0] = '\0';
    local_550._M_p = (pointer)&local_540;
    local_548 = 0;
    local_540._M_local_buf[0] = '\0';
    local_530._M_p = (pointer)&local_520;
    local_528 = 0;
    local_520._M_local_buf[0] = '\0';
    local_8a8[0] = (vector<aliyun::EssDescribeScalingConfigurationsDataDiskType,_std::allocator<aliyun::EssDescribeScalingConfigurationsDataDiskType>_>
                    )0x0;
    local_8a8._1_6_ = 0;
    local_8a8._7_4_ = local_8a8._7_4_ & 0xffffff00;
    local_8b8._0_8_ = (pointer)0x0;
    local_8b8._8_8_ = (pointer)0x0;
    local_928 = 0x676e61682d6e63;
    uStack_921 = 0x7a;
    uStack_920 = 0x68;
    uStack_91f = 0x756f;
    local_930 = 0xb;
    local_91d = 0;
    local_948 = 0x64697070615f796d;
    local_950 = 8;
    local_940 = local_940 & 0xff00;
    local_8d8.field_2._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_8d8.field_2._M_local_buf[7] = 'e';
    local_8d8.field_2._M_local_buf[8] = 't';
    local_8d8._M_string_length = 9;
    local_8d8.field_2._M_local_buf[9] = '\0';
    local_958 = &local_948;
    local_938 = &local_928;
    local_8d8._M_dataplus._M_p = (pointer)paVar3;
    this = (EssDescribeScheduledTasksRequestType *)aliyun::Ess::CreateEssClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8d8._M_dataplus._M_p != paVar3) {
      operator_delete(local_8d8._M_dataplus._M_p,
                      CONCAT17(local_8d8.field_2._M_local_buf[7],
                               local_8d8.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if (local_958 != &local_948) {
      operator_delete(local_958,local_948 + 1);
    }
    if (local_938 != &local_928) {
      operator_delete(local_938,CONCAT17(uStack_921,local_928) + 1);
    }
    if (this != (EssDescribeScheduledTasksRequestType *)0x0) goto LAB_0010b8a1;
    std::
    vector<aliyun::EssDescribeScalingConfigurationsScalingConfigurationType,_std::allocator<aliyun::EssDescribeScalingConfigurationsScalingConfigurationType>_>
    ::~vector((vector<aliyun::EssDescribeScalingConfigurationsScalingConfigurationType,_std::allocator<aliyun::EssDescribeScalingConfigurationsScalingConfigurationType>_>
               *)local_8b8);
    aliyun::EssDescribeScalingConfigurationsRequestType::
    ~EssDescribeScalingConfigurationsRequestType
              ((EssDescribeScalingConfigurationsRequestType *)local_870);
    local_870._0_8_ = local_870 + 0x10;
    local_870._8_8_ = (pointer)0x0;
    local_870[0x10] = '\0';
    local_850._M_p = (pointer)&local_840;
    local_848 = 0;
    local_840._M_local_buf[0] = '\0';
    local_830._M_p = (pointer)&local_820;
    local_828 = 0;
    local_820._M_local_buf[0] = '\0';
    local_810._M_p = (pointer)&local_800;
    local_808 = 0;
    local_800._M_local_buf[0] = '\0';
    local_7f0._M_p = (pointer)&local_7e0;
    local_7e8 = 0;
    local_7e0._M_local_buf[0] = '\0';
    local_7d0._M_p = (pointer)&local_7c0;
    local_7c8 = 0;
    local_7c0._M_local_buf[0] = '\0';
    local_7b0._M_p = (pointer)&local_7a0;
    local_7a8._M_p = (pointer)0x0;
    local_7a0._M_local_buf[0] = '\0';
    local_790 = (string  [8])&local_780;
    local_788._M_p = (pointer)0x0;
    local_780._M_local_buf[0] = '\0';
    local_770 = (string  [8])&local_760;
    local_768._M_p = (pointer)0x0;
    local_760._M_local_buf[0] = '\0';
    local_750 = (string  [8])&local_740;
    local_748 = 0;
    local_740._M_local_buf[0] = '\0';
    local_730._M_p = (pointer)&local_720;
    local_728 = 0;
    local_720._M_local_buf[0] = '\0';
    local_710._M_p = (pointer)&local_700;
    local_708 = 0;
    local_700._M_local_buf[0] = '\0';
    local_6f0._M_p = (pointer)&local_6e0;
    local_6e8 = 0;
    local_6e0._M_local_buf[0] = '\0';
    local_6d0._M_p = (pointer)&local_6c0;
    local_6c8 = 0;
    local_6c0._M_local_buf[0] = '\0';
    local_6b0._M_p = (pointer)&local_6a0;
    local_6a8 = 0;
    local_6a0._M_local_buf[0] = '\0';
    local_690._M_p = (pointer)&local_680;
    local_688 = 0;
    local_680._M_local_buf[0] = '\0';
    local_670._M_p = (pointer)&local_660;
    local_668 = 0;
    local_660._M_local_buf[0] = '\0';
    local_650._M_p = (pointer)&local_640;
    local_648 = 0;
    local_640._M_local_buf[0] = '\0';
    local_630._M_p = (pointer)&local_620;
    local_628 = 0;
    local_620._M_local_buf[0] = '\0';
    local_610._M_p = (pointer)&local_600;
    local_608 = 0;
    local_600._M_local_buf[0] = '\0';
    local_5f0._M_p = (pointer)&local_5e0;
    local_5e8 = 0;
    local_5e0._M_local_buf[0] = '\0';
    local_5d0._M_p = (pointer)&local_5c0;
    local_5c8 = 0;
    local_5c0._M_local_buf[0] = '\0';
    local_5b0._M_p = (pointer)&local_5a0;
    local_5a8 = 0;
    local_5a0._M_local_buf[0] = '\0';
    local_590._M_p = (pointer)&local_580;
    local_588 = 0;
    local_580._M_local_buf[0] = '\0';
    local_570._M_p = (pointer)&local_560;
    local_568 = 0;
    local_560._M_local_buf[0] = '\0';
    local_550._M_p = (pointer)&local_540;
    local_548 = 0;
    local_540._M_local_buf[0] = '\0';
    local_530._M_p = (pointer)&local_520;
    local_528 = 0;
    local_520._M_local_buf[0] = '\0';
    local_510._M_p = (pointer)&local_500;
    local_508 = 0;
    local_500._M_local_buf[0] = '\0';
    local_4f0._M_p = (pointer)&local_4e0;
    local_4e8 = 0;
    local_4e0._M_local_buf[0] = '\0';
    local_4d0._M_p = (pointer)&local_4c0;
    local_4c8 = 0;
    local_4c0._M_local_buf[0] = '\0';
    local_4b0._M_p = (pointer)&local_4a0;
    local_4a8 = 0;
    local_4a0._M_local_buf[0] = '\0';
    local_490._M_p = (pointer)&local_480;
    local_488 = 0;
    local_480._M_local_buf[0] = '\0';
    local_470._M_p = (pointer)&local_460;
    local_468 = 0;
    local_460._M_local_buf[0] = '\0';
    local_450._M_p = (pointer)&local_440;
    local_448 = 0;
    local_440._M_local_buf[0] = '\0';
    local_430._M_p = (pointer)&local_420;
    local_428 = 0;
    local_420._M_local_buf[0] = '\0';
    paVar3 = &local_400;
    local_408 = 0;
    local_400._M_local_buf[0] = '\0';
    local_3e8 = 0;
    local_3e0._M_local_buf[0] = '\0';
    local_3d0._M_p = (pointer)&local_3c0;
    local_3c8 = 0;
    local_3c0._M_local_buf[0] = '\0';
    local_3b0._M_p = (pointer)&local_3a0;
    local_3a8 = 0;
    local_3a0._M_local_buf[0] = '\0';
    local_390._M_p = (pointer)&local_380;
    local_388 = 0;
    local_380._M_local_buf[0] = '\0';
    local_370._M_p = (pointer)&local_360;
    local_368 = 0;
    local_360._M_local_buf[0] = '\0';
    local_350._M_p = (pointer)&local_340;
    local_348 = 0;
    local_340._M_local_buf[0] = '\0';
    local_330._M_p = (pointer)&local_320;
    local_328 = 0;
    local_320._M_local_buf[0] = '\0';
    local_310._M_p = (pointer)&local_300;
    local_308 = 0;
    local_300._M_local_buf[0] = '\0';
    local_2f0._M_p = (pointer)&local_2e0;
    local_2e8 = 0;
    local_2e0._M_local_buf[0] = '\0';
    local_8a8[0] = (vector<aliyun::EssDescribeScalingConfigurationsDataDiskType,_std::allocator<aliyun::EssDescribeScalingConfigurationsDataDiskType>_>
                    )0x0;
    local_8a8._1_6_ = 0;
    local_8a8._7_4_ = local_8a8._7_4_ & 0xffffff00;
    local_8b8._0_8_ = (pointer)0x0;
    local_8b8._8_8_ = (pointer)0x0;
    local_928 = 0x676e61682d6e63;
    uStack_921 = 0x7a;
    uStack_920 = 0x68;
    uStack_91f = 0x756f;
    local_930 = 0xb;
    local_91d = 0;
    local_948 = 0x64697070615f796d;
    local_950 = 8;
    local_940 = local_940 & 0xff00;
    local_8d8.field_2._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_8d8.field_2._M_local_buf[7] = 'e';
    local_8d8.field_2._M_local_buf[8] = 't';
    local_8d8._M_string_length = 9;
    local_8d8.field_2._M_local_buf[9] = '\0';
    local_958 = &local_948;
    local_938 = &local_928;
    local_8d8._M_dataplus._M_p = (pointer)&local_8d8.field_2;
    local_410._M_p = (pointer)paVar3;
    local_3f0._M_p = (pointer)&local_3e0;
    this = (EssDescribeScheduledTasksRequestType *)aliyun::Ess::CreateEssClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8d8._M_dataplus._M_p != &local_8d8.field_2) {
      operator_delete(local_8d8._M_dataplus._M_p,
                      CONCAT17(local_8d8.field_2._M_local_buf[7],
                               local_8d8.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if (local_958 != &local_948) {
      operator_delete(local_958,local_948 + 1);
    }
    if (local_938 != &local_928) {
      operator_delete(local_938,CONCAT17(uStack_921,local_928) + 1);
    }
    if (this != (EssDescribeScheduledTasksRequestType *)0x0) goto LAB_0010bbb1;
    std::
    vector<aliyun::EssDescribeScalingGroupsScalingGroupType,_std::allocator<aliyun::EssDescribeScalingGroupsScalingGroupType>_>
    ::~vector((vector<aliyun::EssDescribeScalingGroupsScalingGroupType,_std::allocator<aliyun::EssDescribeScalingGroupsScalingGroupType>_>
               *)local_8b8);
    aliyun::EssDescribeScalingGroupsRequestType::~EssDescribeScalingGroupsRequestType
              ((EssDescribeScalingGroupsRequestType *)local_870);
    local_870._0_8_ = local_870 + 0x10;
    local_870._8_8_ = (pointer)0x0;
    local_870[0x10] = '\0';
    local_850._M_p = (pointer)&local_840;
    local_848 = 0;
    local_840._M_local_buf[0] = '\0';
    local_830._M_p = (pointer)&local_820;
    local_828 = 0;
    local_820._M_local_buf[0] = '\0';
    local_810._M_p = (pointer)&local_800;
    local_808 = 0;
    local_800._M_local_buf[0] = '\0';
    local_7f0._M_p = (pointer)&local_7e0;
    local_7e8 = 0;
    local_7e0._M_local_buf[0] = '\0';
    local_7d0._M_p = (pointer)&local_7c0;
    local_7c8 = 0;
    local_7c0._M_local_buf[0] = '\0';
    local_7b0._M_p = (pointer)&local_7a0;
    local_7a8._M_p = (pointer)0x0;
    local_7a0._M_local_buf[0] = '\0';
    local_790 = (string  [8])&local_780;
    local_788._M_p = (pointer)0x0;
    local_780._M_local_buf[0] = '\0';
    local_770 = (string  [8])&local_760;
    local_768._M_p = (pointer)0x0;
    local_760._M_local_buf[0] = '\0';
    local_750 = (string  [8])&local_740;
    local_748 = 0;
    local_740._M_local_buf[0] = '\0';
    local_730._M_p = (pointer)&local_720;
    local_728 = 0;
    local_720._M_local_buf[0] = '\0';
    local_710._M_p = (pointer)&local_700;
    local_708 = 0;
    local_700._M_local_buf[0] = '\0';
    local_6f0._M_p = (pointer)&local_6e0;
    local_6e8 = 0;
    local_6e0._M_local_buf[0] = '\0';
    local_6d0._M_p = (pointer)&local_6c0;
    local_6c8 = 0;
    local_6c0._M_local_buf[0] = '\0';
    local_6b0._M_p = (pointer)&local_6a0;
    local_6a8 = 0;
    local_6a0._M_local_buf[0] = '\0';
    local_690._M_p = (pointer)&local_680;
    local_688 = 0;
    local_680._M_local_buf[0] = '\0';
    local_670._M_p = (pointer)&local_660;
    local_668 = 0;
    local_660._M_local_buf[0] = '\0';
    local_650._M_p = (pointer)&local_640;
    local_648 = 0;
    local_640._M_local_buf[0] = '\0';
    local_630._M_p = (pointer)&local_620;
    local_628 = 0;
    local_620._M_local_buf[0] = '\0';
    local_610._M_p = (pointer)&local_600;
    local_608 = 0;
    local_600._M_local_buf[0] = '\0';
    local_5f0._M_p = (pointer)&local_5e0;
    local_5e8 = 0;
    local_5e0._M_local_buf[0] = '\0';
    local_5d0._M_p = (pointer)&local_5c0;
    local_5c8 = 0;
    local_5c0._M_local_buf[0] = '\0';
    local_5b0._M_p = (pointer)&local_5a0;
    local_5a8 = 0;
    local_5a0._M_local_buf[0] = '\0';
    local_590._M_p = (pointer)&local_580;
    local_588 = 0;
    local_580._M_local_buf[0] = '\0';
    local_570._M_p = (pointer)&local_560;
    local_568 = 0;
    local_560._M_local_buf[0] = '\0';
    local_550._M_p = (pointer)&local_540;
    local_548 = 0;
    local_540._M_local_buf[0] = '\0';
    local_530._M_p = (pointer)&local_520;
    local_528 = 0;
    local_520._M_local_buf[0] = '\0';
    local_510._M_p = (pointer)&local_500;
    local_508 = 0;
    local_500._M_local_buf[0] = '\0';
    local_4f0._M_p = (pointer)&local_4e0;
    local_4e8 = 0;
    local_4e0._M_local_buf[0] = '\0';
    local_4d0._M_p = (pointer)&local_4c0;
    local_4c8 = 0;
    local_4c0._M_local_buf[0] = '\0';
    local_4b0._M_p = (pointer)&local_4a0;
    local_4a8 = 0;
    local_4a0._M_local_buf[0] = '\0';
    local_8a8[0] = (vector<aliyun::EssDescribeScalingConfigurationsDataDiskType,_std::allocator<aliyun::EssDescribeScalingConfigurationsDataDiskType>_>
                    )0x0;
    local_8a8._1_6_ = 0;
    local_8a8._7_4_ = local_8a8._7_4_ & 0xffffff00;
    local_8b8._0_8_ = (pointer)0x0;
    local_8b8._8_8_ = (pointer)0x0;
    local_928 = 0x676e61682d6e63;
    uStack_921 = 0x7a;
    uStack_920 = 0x68;
    uStack_91f = 0x756f;
    local_930 = 0xb;
    local_91d = 0;
    local_948 = 0x64697070615f796d;
    local_950 = 8;
    local_940 = local_940 & 0xff00;
    local_8d8.field_2._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_8d8.field_2._M_local_buf[7] = 'e';
    local_8d8.field_2._M_local_buf[8] = 't';
    local_8d8._M_string_length = 9;
    local_8d8.field_2._M_local_buf[9] = '\0';
    local_958 = &local_948;
    local_938 = &local_928;
    local_8d8._M_dataplus._M_p = (pointer)&local_8d8.field_2;
    this = (EssDescribeScheduledTasksRequestType *)aliyun::Ess::CreateEssClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8d8._M_dataplus._M_p != &local_8d8.field_2) {
      operator_delete(local_8d8._M_dataplus._M_p,
                      CONCAT17(local_8d8.field_2._M_local_buf[7],
                               local_8d8.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if (local_958 != &local_948) {
      operator_delete(local_958,local_948 + 1);
    }
    if (local_938 != &local_928) {
      operator_delete(local_938,CONCAT17(uStack_921,local_928) + 1);
    }
    if (this != (EssDescribeScheduledTasksRequestType *)0x0) goto LAB_0010c029;
    std::
    vector<aliyun::EssDescribeScalingInstancesScalingInstanceType,_std::allocator<aliyun::EssDescribeScalingInstancesScalingInstanceType>_>
    ::~vector((vector<aliyun::EssDescribeScalingInstancesScalingInstanceType,_std::allocator<aliyun::EssDescribeScalingInstancesScalingInstanceType>_>
               *)local_8b8);
    aliyun::EssDescribeScalingInstancesRequestType::~EssDescribeScalingInstancesRequestType
              ((EssDescribeScalingInstancesRequestType *)local_870);
    local_870._0_8_ = local_870 + 0x10;
    local_870._8_8_ = (pointer)0x0;
    local_870[0x10] = '\0';
    local_850._M_p = (pointer)&local_840;
    local_848 = 0;
    local_840._M_local_buf[0] = '\0';
    local_830._M_p = (pointer)&local_820;
    local_828 = 0;
    local_820._M_local_buf[0] = '\0';
    local_810._M_p = (pointer)&local_800;
    local_808 = 0;
    local_800._M_local_buf[0] = '\0';
    local_7f0._M_p = (pointer)&local_7e0;
    local_7e8 = 0;
    local_7e0._M_local_buf[0] = '\0';
    local_7d0._M_p = (pointer)&local_7c0;
    local_7c8 = 0;
    local_7c0._M_local_buf[0] = '\0';
    local_7b0._M_p = (pointer)&local_7a0;
    local_7a8._M_p = (pointer)0x0;
    local_7a0._M_local_buf[0] = '\0';
    local_790 = (string  [8])&local_780;
    local_788._M_p = (pointer)0x0;
    local_780._M_local_buf[0] = '\0';
    local_770 = (string  [8])&local_760;
    local_768._M_p = (pointer)0x0;
    local_760._M_local_buf[0] = '\0';
    local_750 = (string  [8])&local_740;
    local_748 = 0;
    local_740._M_local_buf[0] = '\0';
    local_730._M_p = (pointer)&local_720;
    local_728 = 0;
    local_720._M_local_buf[0] = '\0';
    local_710._M_p = (pointer)&local_700;
    local_708 = 0;
    local_700._M_local_buf[0] = '\0';
    local_6f0._M_p = (pointer)&local_6e0;
    local_6e8 = 0;
    local_6e0._M_local_buf[0] = '\0';
    local_6d0._M_p = (pointer)&local_6c0;
    local_6c8 = 0;
    local_6c0._M_local_buf[0] = '\0';
    local_6b0._M_p = (pointer)&local_6a0;
    local_6a8 = 0;
    local_6a0._M_local_buf[0] = '\0';
    local_690._M_p = (pointer)&local_680;
    local_688 = 0;
    local_680._M_local_buf[0] = '\0';
    local_670._M_p = (pointer)&local_660;
    local_668 = 0;
    local_660._M_local_buf[0] = '\0';
    local_650._M_p = (pointer)&local_640;
    local_648 = 0;
    local_640._M_local_buf[0] = '\0';
    local_630._M_p = (pointer)&local_620;
    local_628 = 0;
    local_620._M_local_buf[0] = '\0';
    local_610._M_p = (pointer)&local_600;
    local_608 = 0;
    local_600._M_local_buf[0] = '\0';
    local_5f0._M_p = (pointer)&local_5e0;
    local_5e8 = 0;
    local_5e0._M_local_buf[0] = '\0';
    local_5d0._M_p = (pointer)&local_5c0;
    local_5c8 = 0;
    local_5c0._M_local_buf[0] = '\0';
    local_5b0._M_p = (pointer)&local_5a0;
    local_5a8 = 0;
    local_5a0._M_local_buf[0] = '\0';
    local_590._M_p = (pointer)&local_580;
    local_588 = 0;
    local_580._M_local_buf[0] = '\0';
    local_570._M_p = (pointer)&local_560;
    local_568 = 0;
    local_560._M_local_buf[0] = '\0';
    local_550._M_p = (pointer)&local_540;
    local_548 = 0;
    local_540._M_local_buf[0] = '\0';
    local_530._M_p = (pointer)&local_520;
    local_528 = 0;
    local_520._M_local_buf[0] = '\0';
    local_510._M_p = (pointer)&local_500;
    local_508 = 0;
    local_500._M_local_buf[0] = '\0';
    local_4f0._M_p = (pointer)&local_4e0;
    local_4e8 = 0;
    local_4e0._M_local_buf[0] = '\0';
    local_4d0._M_p = (pointer)&local_4c0;
    local_4c8 = 0;
    local_4c0._M_local_buf[0] = '\0';
    local_4b0._M_p = (pointer)&local_4a0;
    local_4a8 = 0;
    local_4a0._M_local_buf[0] = '\0';
    local_490._M_p = (pointer)&local_480;
    local_488 = 0;
    local_480._M_local_buf[0] = '\0';
    local_470._M_p = (pointer)&local_460;
    local_468 = 0;
    local_460._M_local_buf[0] = '\0';
    local_450._M_p = (pointer)&local_440;
    local_448 = 0;
    local_440._M_local_buf[0] = '\0';
    local_430._M_p = (pointer)&local_420;
    local_428 = 0;
    local_420._M_local_buf[0] = '\0';
    local_408 = 0;
    local_400._M_local_buf[0] = '\0';
    local_3e8 = 0;
    local_3e0._M_local_buf[0] = '\0';
    local_8a8[0] = (vector<aliyun::EssDescribeScalingConfigurationsDataDiskType,_std::allocator<aliyun::EssDescribeScalingConfigurationsDataDiskType>_>
                    )0x0;
    local_8a8._1_6_ = 0;
    local_8a8._7_4_ = local_8a8._7_4_ & 0xffffff00;
    local_8b8._0_8_ = (pointer)0x0;
    local_8b8._8_8_ = (pointer)0x0;
    local_928 = 0x676e61682d6e63;
    uStack_921 = 0x7a;
    uStack_920 = 0x68;
    uStack_91f = 0x756f;
    local_930 = 0xb;
    local_91d = 0;
    local_948 = 0x64697070615f796d;
    local_950 = 8;
    local_940 = local_940 & 0xff00;
    local_8d8.field_2._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_8d8.field_2._M_local_buf[7] = 'e';
    local_8d8.field_2._M_local_buf[8] = 't';
    local_8d8._M_string_length = 9;
    local_8d8.field_2._M_local_buf[9] = '\0';
    local_958 = &local_948;
    local_938 = &local_928;
    local_8d8._M_dataplus._M_p = (pointer)&local_8d8.field_2;
    local_410._M_p = (pointer)paVar3;
    local_3f0._M_p = (pointer)&local_3e0;
    this = (EssDescribeScheduledTasksRequestType *)aliyun::Ess::CreateEssClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8d8._M_dataplus._M_p != &local_8d8.field_2) {
      operator_delete(local_8d8._M_dataplus._M_p,
                      CONCAT17(local_8d8.field_2._M_local_buf[7],
                               local_8d8.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if (local_958 != &local_948) {
      operator_delete(local_958,local_948 + 1);
    }
    if (local_938 != &local_928) {
      operator_delete(local_938,CONCAT17(uStack_921,local_928) + 1);
    }
    paVar4 = paVar3;
    if (this != (EssDescribeScheduledTasksRequestType *)0x0) goto LAB_0010c389;
    std::
    vector<aliyun::EssDescribeScalingRulesScalingRuleType,_std::allocator<aliyun::EssDescribeScalingRulesScalingRuleType>_>
    ::~vector((vector<aliyun::EssDescribeScalingRulesScalingRuleType,_std::allocator<aliyun::EssDescribeScalingRulesScalingRuleType>_>
               *)local_8b8);
    aliyun::EssDescribeScalingRulesRequestType::~EssDescribeScalingRulesRequestType
              ((EssDescribeScalingRulesRequestType *)local_870);
    local_870._0_8_ = local_870 + 0x10;
    local_870._8_8_ = (pointer)0x0;
    local_870[0x10] = '\0';
    local_850._M_p = (pointer)&local_840;
    local_848 = 0;
    local_840._M_local_buf[0] = '\0';
    local_830._M_p = (pointer)&local_820;
    local_828 = 0;
    local_820._M_local_buf[0] = '\0';
    local_810._M_p = (pointer)&local_800;
    local_808 = 0;
    local_800._M_local_buf[0] = '\0';
    local_7f0._M_p = (pointer)&local_7e0;
    local_7e8 = 0;
    local_7e0._M_local_buf[0] = '\0';
    local_7d0._M_p = (pointer)&local_7c0;
    local_7c8 = 0;
    local_7c0._M_local_buf[0] = '\0';
    local_7b0._M_p = (pointer)&local_7a0;
    local_7a8._M_p = (pointer)0x0;
    local_7a0._M_local_buf[0] = '\0';
    local_790 = (string  [8])&local_780;
    local_788._M_p = (pointer)0x0;
    local_780._M_local_buf[0] = '\0';
    local_770 = (string  [8])&local_760;
    local_768._M_p = (pointer)0x0;
    local_760._M_local_buf[0] = '\0';
    local_750 = (string  [8])&local_740;
    local_748 = 0;
    local_740._M_local_buf[0] = '\0';
    local_730._M_p = (pointer)&local_720;
    local_728 = 0;
    local_720._M_local_buf[0] = '\0';
    local_710._M_p = (pointer)&local_700;
    local_708 = 0;
    local_700._M_local_buf[0] = '\0';
    local_6f0._M_p = (pointer)&local_6e0;
    local_6e8 = 0;
    local_6e0._M_local_buf[0] = '\0';
    local_6d0._M_p = (pointer)&local_6c0;
    local_6c8 = 0;
    local_6c0._M_local_buf[0] = '\0';
    local_6b0._M_p = (pointer)&local_6a0;
    local_6a8 = 0;
    local_6a0._M_local_buf[0] = '\0';
    local_690._M_p = (pointer)&local_680;
    local_688 = 0;
    local_680._M_local_buf[0] = '\0';
    local_670._M_p = (pointer)&local_660;
    local_668 = 0;
    local_660._M_local_buf[0] = '\0';
    local_650._M_p = (pointer)&local_640;
    local_648 = 0;
    local_640._M_local_buf[0] = '\0';
    local_630._M_p = (pointer)&local_620;
    local_628 = 0;
    local_620._M_local_buf[0] = '\0';
    local_610._M_p = (pointer)&local_600;
    local_608 = 0;
    local_600._M_local_buf[0] = '\0';
    local_5f0._M_p = (pointer)&local_5e0;
    local_5e8 = 0;
    local_5e0._M_local_buf[0] = '\0';
    local_5d0._M_p = (pointer)&local_5c0;
    local_5c8 = 0;
    local_5c0._M_local_buf[0] = '\0';
    local_5b0._M_p = (pointer)&local_5a0;
    local_5a8 = 0;
    local_5a0._M_local_buf[0] = '\0';
    local_590._M_p = (pointer)&local_580;
    local_588 = 0;
    local_580._M_local_buf[0] = '\0';
    local_570._M_p = (pointer)&local_560;
    local_568 = 0;
    local_560._M_local_buf[0] = '\0';
    local_550._M_p = (pointer)&local_540;
    local_548 = 0;
    local_540._M_local_buf[0] = '\0';
    local_530._M_p = (pointer)&local_520;
    local_528 = 0;
    local_520._M_local_buf[0] = '\0';
    local_510._M_p = (pointer)&local_500;
    local_508 = 0;
    local_500._M_local_buf[0] = '\0';
    local_4f0._M_p = (pointer)&local_4e0;
    local_4e8 = 0;
    local_4e0._M_local_buf[0] = '\0';
    local_4d0._M_p = (pointer)&local_4c0;
    local_4c8 = 0;
    local_4c0._M_local_buf[0] = '\0';
    local_4b0._M_p = (pointer)&local_4a0;
    local_4a8 = 0;
    local_4a0._M_local_buf[0] = '\0';
    local_490._M_p = (pointer)&local_480;
    local_488 = 0;
    local_480._M_local_buf[0] = '\0';
    local_470._M_p = (pointer)&local_460;
    local_468 = 0;
    local_460._M_local_buf[0] = '\0';
    local_450._M_p = (pointer)&local_440;
    local_448 = 0;
    local_440._M_local_buf[0] = '\0';
    local_430._M_p = (pointer)&local_420;
    local_428 = 0;
    local_420._M_local_buf[0] = '\0';
    local_408 = 0;
    local_400._M_local_buf[0] = '\0';
    local_3e8 = 0;
    local_3e0._M_local_buf[0] = '\0';
    local_3d0._M_p = (pointer)&local_3c0;
    local_3c8 = 0;
    local_3c0._M_local_buf[0] = '\0';
    local_3b0._M_p = (pointer)&local_3a0;
    local_3a8 = 0;
    local_3a0._M_local_buf[0] = '\0';
    local_390._M_p = (pointer)&local_380;
    local_388 = 0;
    local_380._M_local_buf[0] = '\0';
    local_370._M_p = (pointer)&local_360;
    local_368 = 0;
    local_360._M_local_buf[0] = '\0';
    local_350._M_p = (pointer)&local_340;
    local_348 = 0;
    local_340._M_local_buf[0] = '\0';
    local_330._M_p = (pointer)&local_320;
    local_328 = 0;
    local_320._M_local_buf[0] = '\0';
    local_310._M_p = (pointer)&local_300;
    local_308 = 0;
    local_300._M_local_buf[0] = '\0';
    local_2f0._M_p = (pointer)&local_2e0;
    local_2e8 = 0;
    local_2e0._M_local_buf[0] = '\0';
    local_2d0._M_p = (pointer)&local_2c0;
    local_2c8 = 0;
    local_2c0._M_local_buf[0] = '\0';
    local_2b0._M_p = (pointer)&local_2a0;
    local_2a8 = 0;
    local_2a0._M_local_buf[0] = '\0';
    local_290._M_p = (pointer)&local_280;
    local_288 = 0;
    local_280._M_local_buf[0] = '\0';
    local_270._M_p = (pointer)&local_260;
    local_268 = 0;
    local_260._M_local_buf[0] = '\0';
    local_250._M_p = (pointer)&local_240;
    local_248 = 0;
    local_240._M_local_buf[0] = '\0';
    local_230._M_p = (pointer)&local_220;
    local_228 = 0;
    local_220._M_local_buf[0] = '\0';
    local_210._M_p = (pointer)&local_200;
    local_208 = 0;
    local_200._M_local_buf[0] = '\0';
    local_1f0._M_p = (pointer)&local_1e0;
    local_1e8 = 0;
    local_1e0._M_local_buf[0] = '\0';
    local_1d0._M_p = (pointer)&local_1c0;
    local_1c8 = 0;
    local_1c0._M_local_buf[0] = '\0';
    local_1b0._M_p = (pointer)&local_1a0;
    local_1a8 = 0;
    local_1a0._M_local_buf[0] = '\0';
    local_190._M_p = (pointer)&local_180;
    local_188 = 0;
    local_180._M_local_buf[0] = '\0';
    local_170._M_p = (pointer)&local_160;
    local_168 = 0;
    local_160._M_local_buf[0] = '\0';
    local_150._M_p = (pointer)&local_140;
    local_148 = 0;
    local_140._M_local_buf[0] = '\0';
    local_130._M_p = (pointer)&local_120;
    local_128 = 0;
    local_120._M_local_buf[0] = '\0';
    local_110._M_p = (pointer)&local_100;
    local_108 = 0;
    local_100._M_local_buf[0] = '\0';
    local_f0._M_p = (pointer)&local_e0;
    local_e8 = 0;
    local_e0._M_local_buf[0] = '\0';
    local_d0._M_p = (pointer)&local_c0;
    local_c8 = 0;
    local_c0._M_local_buf[0] = '\0';
    local_b0._M_p = (pointer)&local_a0;
    local_a8 = 0;
    local_a0._M_local_buf[0] = '\0';
    local_90._M_p = (pointer)&local_80;
    local_88 = 0;
    local_80._M_local_buf[0] = '\0';
    local_70._M_p = (pointer)&local_60;
    local_68 = 0;
    local_60._M_local_buf[0] = '\0';
    local_50._M_p = (pointer)&local_40;
    local_48 = 0;
    local_40._M_local_buf[0] = '\0';
    local_8a8[0] = (vector<aliyun::EssDescribeScalingConfigurationsDataDiskType,_std::allocator<aliyun::EssDescribeScalingConfigurationsDataDiskType>_>
                    )0x0;
    local_8a8._1_6_ = 0;
    local_8a8._7_4_ = local_8a8._7_4_ & 0xffffff00;
    local_8b8._0_8_ = (pointer)0x0;
    local_8b8._8_8_ = (pointer)0x0;
    local_928 = 0x676e61682d6e63;
    uStack_921 = 0x7a;
    uStack_920 = 0x68;
    uStack_91f = 0x756f;
    local_930 = 0xb;
    local_91d = 0;
    local_948 = 0x64697070615f796d;
    local_950 = 8;
    local_940 = local_940 & 0xff00;
    paVar4 = &local_8d8.field_2;
    local_8d8.field_2._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_8d8.field_2._M_local_buf[7] = 'e';
    local_8d8.field_2._M_local_buf[8] = 't';
    local_8d8._M_string_length = 9;
    local_8d8.field_2._M_local_buf[9] = '\0';
    local_958 = &local_948;
    local_938 = &local_928;
    local_8d8._M_dataplus._M_p = (pointer)paVar4;
    local_410._M_p = (pointer)paVar3;
    local_3f0._M_p = (pointer)&local_3e0;
    this = (EssDescribeScheduledTasksRequestType *)aliyun::Ess::CreateEssClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8d8._M_dataplus._M_p != paVar4) {
      operator_delete(local_8d8._M_dataplus._M_p,
                      CONCAT17(local_8d8.field_2._M_local_buf[7],
                               local_8d8.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if (local_958 != &local_948) {
      operator_delete(local_958,local_948 + 1);
    }
    if (local_938 != &local_928) {
      operator_delete(local_938,CONCAT17(uStack_921,local_928) + 1);
    }
    if (this != (EssDescribeScheduledTasksRequestType *)0x0) goto LAB_0010c761;
    std::
    vector<aliyun::EssDescribeScheduledTasksScheduledTaskType,_std::allocator<aliyun::EssDescribeScheduledTasksScheduledTaskType>_>
    ::~vector((vector<aliyun::EssDescribeScheduledTasksScheduledTaskType,_std::allocator<aliyun::EssDescribeScheduledTasksScheduledTaskType>_>
               *)local_8b8);
    aliyun::EssDescribeScheduledTasksRequestType::~EssDescribeScheduledTasksRequestType
              ((EssDescribeScheduledTasksRequestType *)local_870);
    local_870._0_8_ = local_870 + 0x10;
    local_870._8_8_ = (pointer)0x0;
    local_870[0x10] = '\0';
    local_850._M_p = (pointer)&local_840;
    local_848 = 0;
    local_840._M_local_buf[0] = '\0';
    local_830._M_p = (pointer)&local_820;
    local_828 = 0;
    local_820._M_local_buf[0] = '\0';
    local_810._M_p = (pointer)&local_800;
    local_808 = 0;
    local_800._M_local_buf[0] = '\0';
    local_7f0._M_p = (pointer)&local_7e0;
    local_7e8 = 0;
    local_7e0._M_local_buf[0] = '\0';
    local_7d0._M_p = (pointer)&local_7c0;
    local_7c8 = 0;
    local_7c0._M_local_buf[0] = '\0';
    local_7b0._M_p = (pointer)&local_7a0;
    local_7a8._M_p = (pointer)0x0;
    local_7a0._M_local_buf[0] = '\0';
    local_790 = (string  [8])&local_780;
    local_788._M_p = (pointer)0x0;
    local_780._M_local_buf[0] = '\0';
    local_770 = (string  [8])&local_760;
    local_768._M_p = (pointer)0x0;
    local_760._M_local_buf[0] = '\0';
    local_750 = (string  [8])&local_740;
    local_748 = 0;
    local_740._M_local_buf[0] = '\0';
    local_730._M_p = (pointer)&local_720;
    local_728 = 0;
    local_720._M_local_buf[0] = '\0';
    local_710._M_p = (pointer)&local_700;
    local_708 = 0;
    local_700._M_local_buf[0] = '\0';
    local_6f0._M_p = (pointer)&local_6e0;
    local_6e8 = 0;
    local_6e0._M_local_buf[0] = '\0';
    local_6d0._M_p = (pointer)&local_6c0;
    local_6c8 = 0;
    local_6c0._M_local_buf[0] = '\0';
    local_6b0._M_p = (pointer)&local_6a0;
    local_6a8 = 0;
    local_6a0._M_local_buf[0] = '\0';
    local_690._M_p = (pointer)&local_680;
    local_688 = 0;
    local_680._M_local_buf[0] = '\0';
    local_670._M_p = (pointer)&local_660;
    local_668 = 0;
    local_660._M_local_buf[0] = '\0';
    local_650._M_p = (pointer)&local_640;
    local_648 = 0;
    local_640._M_local_buf[0] = '\0';
    local_630._M_p = (pointer)&local_620;
    local_628 = 0;
    local_620._M_local_buf[0] = '\0';
    local_610._M_p = (pointer)&local_600;
    local_608 = 0;
    local_600._M_local_buf[0] = '\0';
    local_5f0._M_p = (pointer)&local_5e0;
    local_5e8 = 0;
    local_5e0._M_local_buf[0] = '\0';
    local_5d0._M_p = (pointer)&local_5c0;
    local_5c8 = 0;
    local_5c0._M_local_buf[0] = '\0';
    local_5b0._M_p = (pointer)&local_5a0;
    local_5a8 = 0;
    local_5a0._M_local_buf[0] = '\0';
    local_590._M_p = (pointer)&local_580;
    local_588 = 0;
    local_580._M_local_buf[0] = '\0';
    local_570._M_p = (pointer)&local_560;
    local_568 = 0;
    local_560._M_local_buf[0] = '\0';
    local_8b8._8_8_ = (pointer)0x0;
    local_8a8[0] = (vector<aliyun::EssDescribeScalingConfigurationsDataDiskType,_std::allocator<aliyun::EssDescribeScalingConfigurationsDataDiskType>_>
                    )0x0;
    local_928 = 0x676e61682d6e63;
    uStack_921 = 0x7a;
    uStack_920 = 0x68;
    uStack_91f = 0x756f;
    local_930 = 0xb;
    local_91d = 0;
    local_948 = 0x64697070615f796d;
    local_950 = 8;
    local_940 = local_940 & 0xff00;
    local_8d8.field_2._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_8d8.field_2._M_local_buf[7] = 'e';
    local_8d8.field_2._M_local_buf[8] = 't';
    local_8d8._M_string_length = 9;
    local_8d8.field_2._M_local_buf[9] = '\0';
    local_958 = &local_948;
    local_938 = &local_928;
    local_8d8._M_dataplus._M_p = (pointer)paVar4;
    local_8b8._0_8_ = (pointer)local_8a8;
    this = (EssDescribeScheduledTasksRequestType *)aliyun::Ess::CreateEssClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8d8._M_dataplus._M_p != paVar4) {
      operator_delete(local_8d8._M_dataplus._M_p,
                      CONCAT17(local_8d8.field_2._M_local_buf[7],
                               local_8d8.field_2._M_allocated_capacity._0_7_) + 1);
    }
    pcVar1 = local_870 + 0x10;
    if (local_958 != &local_948) {
      operator_delete(local_958,local_948 + 1);
    }
    if (local_938 != &local_928) {
      operator_delete(local_938,CONCAT17(uStack_921,local_928) + 1);
    }
    if (this != (EssDescribeScheduledTasksRequestType *)0x0) goto LAB_0010cd7d;
    if ((pointer)local_8b8._0_8_ != (pointer)local_8a8) {
      operator_delete((void *)local_8b8._0_8_,
                      CONCAT17(local_8a8[7],CONCAT61(local_8a8._1_6_,local_8a8[0])) + 1);
    }
    aliyun::EssDetachInstancesRequestType::~EssDetachInstancesRequestType
              ((EssDetachInstancesRequestType *)local_870);
    local_870._8_8_ = (pointer)0x0;
    local_870[0x10] = '\0';
    local_850._M_p = (pointer)&local_840;
    local_848 = 0;
    local_840._M_local_buf[0] = '\0';
    local_830._M_p = (pointer)&local_820;
    local_828 = 0;
    local_820._M_local_buf[0] = '\0';
    local_810._M_p = (pointer)&local_800;
    local_808 = 0;
    local_800._M_local_buf[0] = '\0';
    local_7f0._M_p = (pointer)&local_7e0;
    local_7e8 = 0;
    local_7e0._M_local_buf[0] = '\0';
    local_8a8[0] = (vector<aliyun::EssDescribeScalingConfigurationsDataDiskType,_std::allocator<aliyun::EssDescribeScalingConfigurationsDataDiskType>_>
                    )0x63;
    local_8a8._1_6_ = 0x676e61682d6e;
    local_8a8._7_4_ = 0x756f687a;
    local_8b8._8_8_ = (pointer)0xb;
    local_8a8[0xb] = 0;
    local_928 = 0x697070615f796d;
    uStack_921 = 100;
    local_930 = 8;
    uStack_920 = 0;
    local_948 = 0x65726365735f796d;
    local_950 = 9;
    local_940 = 0x74;
    local_958 = &local_948;
    local_938 = &local_928;
    local_8b8._0_8_ = (pointer)local_8a8;
    local_870._0_8_ = pcVar1;
    this = (EssDescribeScheduledTasksRequestType *)aliyun::Ess::CreateEssClient();
    if (local_958 != &local_948) {
      operator_delete(local_958,local_948 + 1);
    }
    if (local_938 != &local_928) {
      operator_delete(local_938,CONCAT17(uStack_921,local_928) + 1);
    }
    if ((pointer)local_8b8._0_8_ != (pointer)local_8a8) {
      operator_delete((void *)local_8b8._0_8_,
                      CONCAT17(local_8a8[7],CONCAT61(local_8a8._1_6_,local_8a8[0])) + 1);
    }
    if (this != (EssDescribeScheduledTasksRequestType *)0x0) goto LAB_0010d065;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7f0._M_p != &local_7e0) {
      operator_delete(local_7f0._M_p,
                      CONCAT71(local_7e0._M_allocated_capacity._1_7_,local_7e0._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_810._M_p != &local_800) {
      operator_delete(local_810._M_p,
                      CONCAT71(local_800._M_allocated_capacity._1_7_,local_800._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_830._M_p != &local_820) {
      operator_delete(local_830._M_p,
                      CONCAT71(local_820._M_allocated_capacity._1_7_,local_820._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_850._M_p != &local_840) {
      operator_delete(local_850._M_p,
                      CONCAT71(local_840._M_allocated_capacity._1_7_,local_840._M_local_buf[0]) + 1)
      ;
    }
    if ((pointer)local_870._0_8_ != pcVar1) {
      operator_delete((void *)local_870._0_8_,CONCAT71(local_870._17_7_,local_870[0x10]) + 1);
    }
    local_870._8_8_ = (pointer)0x0;
    local_870[0x10] = '\0';
    local_850._M_p = (pointer)&local_840;
    local_848 = 0;
    local_840._M_local_buf[0] = '\0';
    local_830._M_p = (pointer)&local_820;
    local_828 = 0;
    local_820._M_local_buf[0] = '\0';
    local_810._M_p = (pointer)&local_800;
    local_808 = 0;
    local_800._M_local_buf[0] = '\0';
    local_7f0._M_p = (pointer)&local_7e0;
    local_7e8 = 0;
    local_7e0._M_local_buf[0] = '\0';
    local_7d0._M_p = (pointer)&local_7c0;
    local_7c8 = 0;
    local_7c0._M_local_buf[0] = '\0';
    local_7b0._M_p = (pointer)&local_7a0;
    local_7a8._M_p = (pointer)0x0;
    local_7a0._M_local_buf[0] = '\0';
    local_790 = (string  [8])&local_780;
    local_788._M_p = (pointer)0x0;
    local_780._M_local_buf[0] = '\0';
    local_770 = (string  [8])&local_760;
    local_768._M_p = (pointer)0x0;
    local_760._M_local_buf[0] = '\0';
    local_750 = (string  [8])&local_740;
    local_748 = 0;
    local_740._M_local_buf[0] = '\0';
    local_730._M_p = (pointer)&local_720;
    local_728 = 0;
    local_720._M_local_buf[0] = '\0';
    local_710._M_p = (pointer)&local_700;
    local_708 = 0;
    local_700._M_local_buf[0] = '\0';
    local_6f0._M_p = (pointer)&local_6e0;
    local_6e8 = 0;
    local_6e0._M_local_buf[0] = '\0';
    local_6d0._M_p = (pointer)&local_6c0;
    local_6c8 = 0;
    local_6c0._M_local_buf[0] = '\0';
    local_6b0._M_p = (pointer)&local_6a0;
    local_6a8 = 0;
    local_6a0._M_local_buf[0] = '\0';
    local_690._M_p = (pointer)&local_680;
    local_688 = 0;
    local_680._M_local_buf[0] = '\0';
    local_670._M_p = (pointer)&local_660;
    local_668 = 0;
    local_660._M_local_buf[0] = '\0';
    local_650._M_p = (pointer)&local_640;
    local_648 = 0;
    local_640._M_local_buf[0] = '\0';
    local_630._M_p = (pointer)&local_620;
    local_628 = 0;
    local_620._M_local_buf[0] = '\0';
    local_610._M_p = (pointer)&local_600;
    local_608 = 0;
    local_600._M_local_buf[0] = '\0';
    local_5f0._M_p = (pointer)&local_5e0;
    local_5e8 = 0;
    local_5e0._M_local_buf[0] = '\0';
    local_5d0._M_p = (pointer)&local_5c0;
    local_5c8 = 0;
    local_5c0._M_local_buf[0] = '\0';
    local_5b0._M_p = (pointer)&local_5a0;
    local_5a8 = 0;
    local_5a0._M_local_buf[0] = '\0';
    local_590._M_p = (pointer)&local_580;
    local_588 = 0;
    local_580._M_local_buf[0] = '\0';
    local_570._M_p = (pointer)&local_560;
    local_568 = 0;
    local_560._M_local_buf[0] = '\0';
    local_550._M_p = (pointer)&local_540;
    local_548 = 0;
    local_540._M_local_buf[0] = '\0';
    local_8a8[0] = (vector<aliyun::EssDescribeScalingConfigurationsDataDiskType,_std::allocator<aliyun::EssDescribeScalingConfigurationsDataDiskType>_>
                    )0x63;
    local_8a8._1_6_ = 0x676e61682d6e;
    local_8a8._7_4_ = 0x756f687a;
    local_8b8._8_8_ = (pointer)0xb;
    local_8a8[0xb] = 0;
    local_928 = 0x697070615f796d;
    uStack_921 = 100;
    local_930 = 8;
    uStack_920 = 0;
    local_948 = 0x65726365735f796d;
    local_940 = 0x74;
    local_950 = 9;
    local_958 = &local_948;
    local_938 = &local_928;
    local_8b8._0_8_ = (pointer)local_8a8;
    local_870._0_8_ = pcVar1;
    this = (EssDescribeScheduledTasksRequestType *)aliyun::Ess::CreateEssClient();
    if (local_958 != &local_948) {
      operator_delete(local_958,local_948 + 1);
    }
    if (local_938 != &local_928) {
      operator_delete(local_938,CONCAT17(uStack_921,local_928) + 1);
    }
    if ((pointer)local_8b8._0_8_ != (pointer)local_8a8) {
      operator_delete((void *)local_8b8._0_8_,
                      CONCAT17(local_8a8[7],CONCAT61(local_8a8._1_6_,local_8a8[0])) + 1);
    }
    if (this != (EssDescribeScheduledTasksRequestType *)0x0) goto LAB_0010d1b6;
    aliyun::EssEnableScalingGroupRequestType::~EssEnableScalingGroupRequestType
              ((EssEnableScalingGroupRequestType *)local_870);
    local_870._8_8_ = (pointer)0x0;
    local_870[0x10] = '\0';
    local_850._M_p = (pointer)&local_840;
    local_848 = 0;
    local_840._M_local_buf[0] = '\0';
    local_830._M_p = (pointer)&local_820;
    local_828 = 0;
    local_820._M_local_buf[0] = '\0';
    local_810._M_p = (pointer)&local_800;
    local_808 = 0;
    local_800._M_local_buf[0] = '\0';
    local_7f0._M_p = (pointer)&local_7e0;
    local_7e8 = 0;
    local_7e0._M_local_buf[0] = '\0';
    local_7d0._M_p = (pointer)&local_7c0;
    local_7c8 = 0;
    local_7c0._M_local_buf[0] = '\0';
    local_8b8._8_8_ = (pointer)0x0;
    local_8a8[0] = (vector<aliyun::EssDescribeScalingConfigurationsDataDiskType,_std::allocator<aliyun::EssDescribeScalingConfigurationsDataDiskType>_>
                    )0x0;
    local_928 = 0x676e61682d6e63;
    uStack_921 = 0x7a;
    uStack_920 = 0x68;
    uStack_91f = 0x756f;
    local_930 = 0xb;
    local_91d = 0;
    local_948 = 0x64697070615f796d;
    local_950 = 8;
    local_940 = local_940 & 0xff00;
    local_8d8.field_2._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_8d8.field_2._M_local_buf[7] = 'e';
    local_8d8.field_2._M_local_buf[8] = 't';
    local_8d8._M_string_length = 9;
    local_8d8.field_2._M_local_buf[9] = '\0';
    local_958 = &local_948;
    local_938 = &local_928;
    local_8d8._M_dataplus._M_p = (pointer)paVar4;
    local_8b8._0_8_ = (pointer)local_8a8;
    local_870._0_8_ = pcVar1;
    this = (EssDescribeScheduledTasksRequestType *)aliyun::Ess::CreateEssClient();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8d8._M_dataplus._M_p != paVar4) {
      operator_delete(local_8d8._M_dataplus._M_p,
                      CONCAT17(local_8d8.field_2._M_local_buf[7],
                               local_8d8.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if (local_958 != &local_948) {
      operator_delete(local_958,local_948 + 1);
    }
    if (local_938 != &local_928) {
      operator_delete(local_938,CONCAT17(uStack_921,local_928) + 1);
    }
    if (this != (EssDescribeScheduledTasksRequestType *)0x0) goto LAB_0010d4ab;
    if ((pointer)local_8b8._0_8_ != (pointer)local_8a8) {
      operator_delete((void *)local_8b8._0_8_,
                      CONCAT17(local_8a8[7],CONCAT61(local_8a8._1_6_,local_8a8[0])) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7d0._M_p != &local_7c0) {
      operator_delete(local_7d0._M_p,
                      CONCAT71(local_7c0._M_allocated_capacity._1_7_,local_7c0._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7f0._M_p != &local_7e0) {
      operator_delete(local_7f0._M_p,
                      CONCAT71(local_7e0._M_allocated_capacity._1_7_,local_7e0._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_810._M_p != &local_800) {
      operator_delete(local_810._M_p,
                      CONCAT71(local_800._M_allocated_capacity._1_7_,local_800._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_830._M_p != &local_820) {
      operator_delete(local_830._M_p,
                      CONCAT71(local_820._M_allocated_capacity._1_7_,local_820._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_850._M_p != &local_840) {
      operator_delete(local_850._M_p,
                      CONCAT71(local_840._M_allocated_capacity._1_7_,local_840._M_local_buf[0]) + 1)
      ;
    }
    if ((pointer)local_870._0_8_ != pcVar1) {
      operator_delete((void *)local_870._0_8_,CONCAT71(local_870._17_7_,local_870[0x10]) + 1);
    }
    local_870._8_8_ = (pointer)0x0;
    local_870[0x10] = '\0';
    local_850._M_p = (pointer)&local_840;
    local_848 = 0;
    local_840._M_local_buf[0] = '\0';
    local_830._M_p = (pointer)&local_820;
    local_828 = 0;
    local_820._M_local_buf[0] = '\0';
    local_810._M_p = (pointer)&local_800;
    local_808 = 0;
    local_800._M_local_buf[0] = '\0';
    local_7f0._M_p = (pointer)&local_7e0;
    local_7e8 = 0;
    local_7e0._M_local_buf[0] = '\0';
    local_7d0._M_p = (pointer)&local_7c0;
    local_7c8 = 0;
    local_7c0._M_local_buf[0] = '\0';
    local_7b0._M_p = (pointer)&local_7a0;
    local_7a8._M_p = (pointer)0x0;
    local_7a0._M_local_buf[0] = '\0';
    local_790 = (string  [8])&local_780;
    local_788._M_p = (pointer)0x0;
    local_780._M_local_buf[0] = '\0';
    local_770 = (string  [8])&local_760;
    local_768._M_p = (pointer)0x0;
    local_760._M_local_buf[0] = '\0';
    local_750 = (string  [8])&local_740;
    local_748 = 0;
    local_740._M_local_buf[0] = '\0';
    local_730._M_p = (pointer)&local_720;
    local_728 = 0;
    local_720._M_local_buf[0] = '\0';
    local_710._M_p = (pointer)&local_700;
    local_708 = 0;
    local_700._M_local_buf[0] = '\0';
    local_8a8[0] = (vector<aliyun::EssDescribeScalingConfigurationsDataDiskType,_std::allocator<aliyun::EssDescribeScalingConfigurationsDataDiskType>_>
                    )0x63;
    local_8a8._1_6_ = 0x676e61682d6e;
    local_8a8._7_4_ = 0x756f687a;
    local_8b8._8_8_ = (pointer)0xb;
    local_8a8[0xb] = 0;
    local_928 = 0x697070615f796d;
    uStack_921 = 100;
    local_930 = 8;
    uStack_920 = 0;
    local_948 = 0x65726365735f796d;
    local_940 = 0x74;
    local_950 = 9;
    local_958 = &local_948;
    local_938 = &local_928;
    local_8b8._0_8_ = (pointer)local_8a8;
    local_870._0_8_ = pcVar1;
    this = (EssDescribeScheduledTasksRequestType *)aliyun::Ess::CreateEssClient();
    if (local_958 != &local_948) {
      operator_delete(local_958,local_948 + 1);
    }
    if (local_938 != &local_928) {
      operator_delete(local_938,CONCAT17(uStack_921,local_928) + 1);
    }
    if ((pointer)local_8b8._0_8_ != (pointer)local_8a8) {
      operator_delete((void *)local_8b8._0_8_,
                      CONCAT17(local_8a8[7],CONCAT61(local_8a8._1_6_,local_8a8[0])) + 1);
    }
    if (this != (EssDescribeScheduledTasksRequestType *)0x0) goto LAB_0010d617;
    aliyun::EssModifyScalingGroupRequestType::~EssModifyScalingGroupRequestType
              ((EssModifyScalingGroupRequestType *)local_870);
    local_870._8_8_ = (pointer)0x0;
    local_870[0x10] = '\0';
    local_850._M_p = (pointer)&local_840;
    local_848 = 0;
    local_840._M_local_buf[0] = '\0';
    local_830._M_p = (pointer)&local_820;
    local_828 = 0;
    local_820._M_local_buf[0] = '\0';
    local_810._M_p = (pointer)&local_800;
    local_808 = 0;
    local_800._M_local_buf[0] = '\0';
    local_7f0._M_p = (pointer)&local_7e0;
    local_7e8 = 0;
    local_7e0._M_local_buf[0] = '\0';
    local_7d0._M_p = (pointer)&local_7c0;
    local_7c8 = 0;
    local_7c0._M_local_buf[0] = '\0';
    local_7b0._M_p = (pointer)&local_7a0;
    local_7a8._M_p = (pointer)0x0;
    local_7a0._M_local_buf[0] = '\0';
    local_790 = (string  [8])&local_780;
    local_788._M_p = (pointer)0x0;
    local_780._M_local_buf[0] = '\0';
    local_770 = (string  [8])&local_760;
    local_768._M_p = (pointer)0x0;
    local_760._M_local_buf[0] = '\0';
    local_8a8[0] = (vector<aliyun::EssDescribeScalingConfigurationsDataDiskType,_std::allocator<aliyun::EssDescribeScalingConfigurationsDataDiskType>_>
                    )0x63;
    local_8a8._1_6_ = 0x676e61682d6e;
    local_8a8._7_4_ = 0x756f687a;
    local_8b8._8_8_ = (pointer)0xb;
    local_8a8[0xb] = 0;
    local_928 = 0x697070615f796d;
    uStack_921 = 100;
    local_930 = 8;
    uStack_920 = 0;
    local_948 = 0x65726365735f796d;
    local_940 = 0x74;
    local_950 = 9;
    local_958 = &local_948;
    local_938 = &local_928;
    local_8b8._0_8_ = (pointer)local_8a8;
    local_870._0_8_ = pcVar1;
    this = (EssDescribeScheduledTasksRequestType *)aliyun::Ess::CreateEssClient();
    if (local_958 != &local_948) {
      operator_delete(local_958,local_948 + 1);
    }
    if (local_938 != &local_928) {
      operator_delete(local_938,CONCAT17(uStack_921,local_928) + 1);
    }
    if ((pointer)local_8b8._0_8_ != (pointer)local_8a8) {
      operator_delete((void *)local_8b8._0_8_,
                      CONCAT17(local_8a8[7],CONCAT61(local_8a8._1_6_,local_8a8[0])) + 1);
    }
    if (this != (EssDescribeScheduledTasksRequestType *)0x0) goto LAB_0010d7f4;
    aliyun::EssModifyScalingRuleRequestType::~EssModifyScalingRuleRequestType
              ((EssModifyScalingRuleRequestType *)local_870);
    local_870._8_8_ = (pointer)0x0;
    local_870[0x10] = '\0';
    local_850._M_p = (pointer)&local_840;
    local_848 = 0;
    local_840._M_local_buf[0] = '\0';
    local_830._M_p = (pointer)&local_820;
    local_828 = 0;
    local_820._M_local_buf[0] = '\0';
    local_810._M_p = (pointer)&local_800;
    local_808 = 0;
    local_800._M_local_buf[0] = '\0';
    local_7f0._M_p = (pointer)&local_7e0;
    local_7e8 = 0;
    local_7e0._M_local_buf[0] = '\0';
    local_7d0._M_p = (pointer)&local_7c0;
    local_7c8 = 0;
    local_7c0._M_local_buf[0] = '\0';
    local_7b0._M_p = (pointer)&local_7a0;
    local_7a8._M_p = (pointer)0x0;
    local_7a0._M_local_buf[0] = '\0';
    local_790 = (string  [8])&local_780;
    local_788._M_p = (pointer)0x0;
    local_780._M_local_buf[0] = '\0';
    local_770 = (string  [8])&local_760;
    local_768._M_p = (pointer)0x0;
    local_760._M_local_buf[0] = '\0';
    local_750 = (string  [8])&local_740;
    local_748 = 0;
    local_740._M_local_buf[0] = '\0';
    local_730._M_p = (pointer)&local_720;
    local_728 = 0;
    local_720._M_local_buf[0] = '\0';
    local_710._M_p = (pointer)&local_700;
    local_708 = 0;
    local_700._M_local_buf[0] = '\0';
    local_6f0._M_p = (pointer)&local_6e0;
    local_6e8 = 0;
    local_6e0._M_local_buf[0] = '\0';
    local_6d0._M_p = (pointer)&local_6c0;
    local_6c8 = 0;
    local_6c0._M_local_buf[0] = '\0';
    local_8a8[0] = (vector<aliyun::EssDescribeScalingConfigurationsDataDiskType,_std::allocator<aliyun::EssDescribeScalingConfigurationsDataDiskType>_>
                    )0x63;
    local_8a8._1_6_ = 0x676e61682d6e;
    local_8a8._7_4_ = 0x756f687a;
    local_8b8._8_8_ = (pointer)0xb;
    local_8a8[0xb] = 0;
    local_928 = 0x697070615f796d;
    uStack_921 = 100;
    local_930 = 8;
    uStack_920 = 0;
    local_948 = 0x65726365735f796d;
    local_940 = 0x74;
    local_950 = 9;
    local_958 = &local_948;
    local_938 = &local_928;
    local_8b8._0_8_ = (pointer)local_8a8;
    local_870._0_8_ = pcVar1;
    this = (EssDescribeScheduledTasksRequestType *)aliyun::Ess::CreateEssClient();
    if (local_958 != &local_948) {
      operator_delete(local_958,local_948 + 1);
    }
    if (local_938 != &local_928) {
      operator_delete(local_938,CONCAT17(uStack_921,local_928) + 1);
    }
    if ((pointer)local_8b8._0_8_ != (pointer)local_8a8) {
      operator_delete((void *)local_8b8._0_8_,
                      CONCAT17(local_8a8[7],CONCAT61(local_8a8._1_6_,local_8a8[0])) + 1);
    }
    if (this == (EssDescribeScheduledTasksRequestType *)0x0) {
      aliyun::EssModifyScheduledTaskRequestType::~EssModifyScheduledTaskRequestType
                ((EssModifyScheduledTaskRequestType *)local_870);
      local_870._8_8_ = (pointer)0x0;
      local_870[0x10] = '\0';
      local_850._M_p = (pointer)&local_840;
      local_848 = 0;
      local_840._M_local_buf[0] = '\0';
      local_830._M_p = (pointer)&local_820;
      local_828 = 0;
      local_820._M_local_buf[0] = '\0';
      local_810._M_p = (pointer)&local_800;
      local_808 = 0;
      local_800._M_local_buf[0] = '\0';
      local_7f0._M_p = (pointer)&local_7e0;
      local_7e8 = 0;
      local_7e0._M_local_buf[0] = '\0';
      local_7d0._M_p = (pointer)&local_7c0;
      local_7c8 = 0;
      local_7c0._M_local_buf[0] = '\0';
      local_7b0._M_p = (pointer)&local_7a0;
      local_7a8._M_p = (pointer)0x0;
      local_7a0._M_local_buf[0] = '\0';
      local_790 = (string  [8])&local_780;
      local_788._M_p = (pointer)0x0;
      local_780._M_local_buf[0] = '\0';
      local_770 = (string  [8])&local_760;
      local_768._M_p = (pointer)0x0;
      local_760._M_local_buf[0] = '\0';
      local_750 = (string  [8])&local_740;
      local_748 = 0;
      local_740._M_local_buf[0] = '\0';
      local_730._M_p = (pointer)&local_720;
      local_728 = 0;
      local_720._M_local_buf[0] = '\0';
      local_710._M_p = (pointer)&local_700;
      local_708 = 0;
      local_700._M_local_buf[0] = '\0';
      local_6f0._M_p = (pointer)&local_6e0;
      local_6e8 = 0;
      local_6e0._M_local_buf[0] = '\0';
      local_6d0._M_p = (pointer)&local_6c0;
      local_6c8 = 0;
      local_6c0._M_local_buf[0] = '\0';
      local_6b0._M_p = (pointer)&local_6a0;
      local_6a8 = 0;
      local_6a0._M_local_buf[0] = '\0';
      local_690._M_p = (pointer)&local_680;
      local_688 = 0;
      local_680._M_local_buf[0] = '\0';
      local_670._M_p = (pointer)&local_660;
      local_668 = 0;
      local_660._M_local_buf[0] = '\0';
      local_650._M_p = (pointer)&local_640;
      local_648 = 0;
      local_640._M_local_buf[0] = '\0';
      local_630._M_p = (pointer)&local_620;
      local_628 = 0;
      local_620._M_local_buf[0] = '\0';
      local_610._M_p = (pointer)&local_600;
      local_608 = 0;
      local_600._M_local_buf[0] = '\0';
      local_5f0._M_p = (pointer)&local_5e0;
      local_5e8 = 0;
      local_5e0._M_local_buf[0] = '\0';
      local_5d0._M_p = (pointer)&local_5c0;
      local_5c8 = 0;
      local_5c0._M_local_buf[0] = '\0';
      local_5b0._M_p = (pointer)&local_5a0;
      local_5a8 = 0;
      local_5a0._M_local_buf[0] = '\0';
      local_590._M_p = (pointer)&local_580;
      local_588 = 0;
      local_580._M_local_buf[0] = '\0';
      local_570._M_p = (pointer)&local_560;
      local_568 = 0;
      local_560._M_local_buf[0] = '\0';
      local_928 = 0x676e61682d6e63;
      local_948 = 0x64697070615f796d;
      local_8d8.field_2._M_allocated_capacity._0_7_ = 0x726365735f796d;
      local_8d8.field_2._M_local_buf[7] = 'e';
      local_8b8._8_8_ = (pointer)0x0;
      local_8a8[0] = (vector<aliyun::EssDescribeScalingConfigurationsDataDiskType,_std::allocator<aliyun::EssDescribeScalingConfigurationsDataDiskType>_>
                      )0x0;
      uStack_921 = 0x7a;
      uStack_920 = 0x68;
      uStack_91f = 0x756f;
      local_930 = 0xb;
      local_91d = 0;
      local_950 = 8;
      local_940 = local_940 & 0xff00;
      local_8d8.field_2._M_local_buf[8] = 't';
      local_8d8._M_string_length = 9;
      local_8d8.field_2._M_local_buf[9] = '\0';
      local_958 = &local_948;
      local_938 = &local_928;
      local_8d8._M_dataplus._M_p = (pointer)paVar4;
      local_8b8._0_8_ = (pointer)local_8a8;
      local_870._0_8_ = pcVar1;
      this = (EssDescribeScheduledTasksRequestType *)aliyun::Ess::CreateEssClient();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_8d8._M_dataplus._M_p != paVar4) {
        operator_delete(local_8d8._M_dataplus._M_p,
                        CONCAT17(local_8d8.field_2._M_local_buf[7],
                                 local_8d8.field_2._M_allocated_capacity._0_7_) + 1);
      }
      if (local_958 != &local_948) {
        operator_delete(local_958,local_948 + 1);
      }
      if (local_938 != &local_928) {
        operator_delete(local_938,CONCAT17(uStack_921,local_928) + 1);
      }
      if (this == (EssDescribeScheduledTasksRequestType *)0x0) {
        if ((pointer)local_8b8._0_8_ != (pointer)local_8a8) {
          operator_delete((void *)local_8b8._0_8_,
                          CONCAT17(local_8a8[7],CONCAT61(local_8a8._1_6_,local_8a8[0])) + 1);
        }
        aliyun::EssRemoveInstancesRequestType::~EssRemoveInstancesRequestType
                  ((EssRemoveInstancesRequestType *)local_870);
        return 0;
      }
      goto LAB_0010db9a;
    }
  }
  else {
    local_8f8.field_2._M_allocated_capacity._0_2_ = 0x3231;
    local_8f8.field_2._M_local_buf[2] = '7';
    local_8f8.field_2._M_allocated_capacity._3_4_ = 0x302e302e;
    local_8f8.field_2._M_local_buf[7] = '.';
    local_8f8.field_2._8_7_ = 0x34333232313a31;
    local_8f8._M_string_length = 0xf;
    local_8f8.field_2._M_local_buf[0xf] = '\0';
    local_8f8._M_dataplus._M_p = (pointer)&local_8f8.field_2;
    aliyun::Ess::SetProxyHost((Ess *)this,&local_8f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
      operator_delete(local_8f8._M_dataplus._M_p,
                      CONCAT17(local_8f8.field_2._M_local_buf[7],
                               CONCAT43(local_8f8.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_8f8.field_2._M_local_buf[2],
                                                 local_8f8.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar2 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar2,0x2fca);
    local_918._M_dataplus._M_p = (pointer)&local_918.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_918,"{  \"ScalingActivityId\": \"ScalingActivityId\"}","");
    HttpTestListener::SetResponseBody(pHVar2,&local_918);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_918._M_dataplus._M_p != &local_918.field_2) {
      operator_delete(local_918._M_dataplus._M_p,local_918.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar2);
    std::__cxx11::string::operator=((string *)local_870,"OwnerId");
    std::__cxx11::string::operator=((string *)&local_850,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)&local_830,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_810,"ScalingGroupId");
    std::__cxx11::string::operator=((string *)&local_7f0,"InstanceId.1");
    std::__cxx11::string::operator=((string *)&local_7d0,"InstanceId.2");
    std::__cxx11::string::operator=((string *)&local_7b0,"InstanceId.3");
    std::__cxx11::string::operator=(local_790,"InstanceId.4");
    std::__cxx11::string::operator=(local_770,"InstanceId.5");
    std::__cxx11::string::operator=(local_750,"InstanceId.6");
    std::__cxx11::string::operator=((string *)&local_730,"InstanceId.7");
    std::__cxx11::string::operator=((string *)&local_710,"InstanceId.8");
    std::__cxx11::string::operator=((string *)&local_6f0,"InstanceId.9");
    std::__cxx11::string::operator=((string *)&local_6d0,"InstanceId.10");
    std::__cxx11::string::operator=((string *)&local_6b0,"InstanceId.11");
    std::__cxx11::string::operator=((string *)&local_690,"InstanceId.12");
    std::__cxx11::string::operator=((string *)&local_670,"InstanceId.13");
    std::__cxx11::string::operator=((string *)&local_650,"InstanceId.14");
    std::__cxx11::string::operator=((string *)&local_630,"InstanceId.15");
    std::__cxx11::string::operator=((string *)&local_610,"InstanceId.16");
    std::__cxx11::string::operator=((string *)&local_5f0,"InstanceId.17");
    std::__cxx11::string::operator=((string *)&local_5d0,"InstanceId.18");
    std::__cxx11::string::operator=((string *)&local_5b0,"InstanceId.19");
    std::__cxx11::string::operator=((string *)&local_590,"InstanceId.20");
    std::__cxx11::string::operator=((string *)&local_570,"OwnerAccount");
    aliyun::Ess::AttachInstances
              ((EssAttachInstancesRequestType *)this,(EssAttachInstancesResponseType *)local_870,
               (EssErrorInfo *)local_8b8);
    HttpTestListener::WaitComplete(pHVar2);
    main_cold_1();
LAB_0010a6f1:
    local_8f8.field_2._M_allocated_capacity._0_2_ = 0x3231;
    local_8f8.field_2._M_local_buf[2] = '7';
    local_8f8.field_2._M_allocated_capacity._3_4_ = 0x302e302e;
    local_8f8.field_2._M_local_buf[7] = '.';
    local_8f8.field_2._8_7_ = 0x34333232313a31;
    local_8f8._M_string_length = 0xf;
    local_8f8.field_2._M_local_buf[0xf] = '\0';
    local_8f8._M_dataplus._M_p = (pointer)&local_8f8.field_2;
    aliyun::Ess::SetProxyHost((Ess *)this,&local_8f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
      operator_delete(local_8f8._M_dataplus._M_p,
                      CONCAT17(local_8f8.field_2._M_local_buf[7],
                               CONCAT43(local_8f8.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_8f8.field_2._M_local_buf[2],
                                                 local_8f8.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar2 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar2,0x2fca);
    local_918._M_dataplus._M_p = (pointer)&local_918.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_918,"{  \"ScalingConfigurationId\": \"ScalingConfigurationId\"}","")
    ;
    HttpTestListener::SetResponseBody(pHVar2,&local_918);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_918._M_dataplus._M_p != &local_918.field_2) {
      operator_delete(local_918._M_dataplus._M_p,local_918.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar2);
    std::__cxx11::string::operator=((string *)local_870,"OwnerId");
    std::__cxx11::string::operator=((string *)&local_850,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)&local_830,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_810,"ScalingGroupId");
    std::__cxx11::string::operator=((string *)&local_7f0,"ImageId");
    std::__cxx11::string::operator=((string *)&local_7d0,"InstanceType");
    std::__cxx11::string::operator=((string *)&local_7b0,"SecurityGroupId");
    std::__cxx11::string::operator=(local_790,"InternetChargeType");
    std::__cxx11::string::operator=(local_770,"InternetMaxBandwidthIn");
    std::__cxx11::string::operator=(local_750,"InternetMaxBandwidthOut");
    std::__cxx11::string::operator=((string *)&local_730,"SystemDisk.Category");
    std::__cxx11::string::operator=((string *)&local_710,"ScalingConfigurationName");
    std::__cxx11::string::operator=((string *)&local_6f0,"DataDisk.1.Size");
    std::__cxx11::string::operator=((string *)&local_6d0,"DataDisk.2.Size");
    std::__cxx11::string::operator=((string *)&local_6b0,"DataDisk.3.Size");
    std::__cxx11::string::operator=((string *)&local_690,"DataDisk.4.Size");
    std::__cxx11::string::operator=((string *)&local_670,"DataDisk.1.Category");
    std::__cxx11::string::operator=((string *)&local_650,"DataDisk.2.Category");
    std::__cxx11::string::operator=((string *)&local_630,"DataDisk.3.Category");
    std::__cxx11::string::operator=((string *)&local_610,"DataDisk.4.Category");
    std::__cxx11::string::operator=((string *)&local_5f0,"DataDisk.1.SnapshotId");
    std::__cxx11::string::operator=((string *)&local_5d0,"DataDisk.2.SnapshotId");
    std::__cxx11::string::operator=((string *)&local_5b0,"DataDisk.3.SnapshotId");
    std::__cxx11::string::operator=((string *)&local_590,"DataDisk.4.SnapshotId");
    std::__cxx11::string::operator=((string *)&local_570,"DataDisk.1.Device");
    std::__cxx11::string::operator=((string *)&local_550,"DataDisk.2.Device");
    std::__cxx11::string::operator=((string *)&local_530,"DataDisk.3.Device");
    std::__cxx11::string::operator=((string *)&local_510,"DataDisk.4.Device");
    std::__cxx11::string::operator=((string *)&local_4f0,"DataDisk.1.DeleteWithInstance");
    std::__cxx11::string::operator=((string *)&local_4d0,"DataDisk.2.DeleteWithInstance");
    std::__cxx11::string::operator=((string *)&local_4b0,"DataDisk.3.DeleteWithInstance");
    std::__cxx11::string::operator=((string *)&local_490,"DataDisk.4.DeleteWithInstance");
    std::__cxx11::string::operator=((string *)&local_470,"OwnerAccount");
    aliyun::Ess::CreateScalingConfiguration
              ((EssCreateScalingConfigurationRequestType *)this,
               (EssCreateScalingConfigurationResponseType *)local_870,(EssErrorInfo *)local_8b8);
    HttpTestListener::WaitComplete(pHVar2);
    main_cold_2();
LAB_0010aa79:
    local_8f8.field_2._M_allocated_capacity._0_2_ = 0x3231;
    local_8f8.field_2._M_local_buf[2] = '7';
    local_8f8.field_2._M_allocated_capacity._3_4_ = 0x302e302e;
    local_8f8.field_2._M_local_buf[7] = '.';
    local_8f8.field_2._8_7_ = 0x34333232313a31;
    local_8f8._M_string_length = 0xf;
    local_8f8.field_2._M_local_buf[0xf] = '\0';
    local_8f8._M_dataplus._M_p = (pointer)&local_8f8.field_2;
    aliyun::Ess::SetProxyHost((Ess *)this,&local_8f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
      operator_delete(local_8f8._M_dataplus._M_p,
                      CONCAT17(local_8f8.field_2._M_local_buf[7],
                               CONCAT43(local_8f8.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_8f8.field_2._M_local_buf[2],
                                                 local_8f8.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar2 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar2,0x2fca);
    local_918._M_dataplus._M_p = (pointer)&local_918.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_918,"{  \"ScalingGroupId\": \"ScalingGroupId\"}","");
    HttpTestListener::SetResponseBody(pHVar2,&local_918);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_918._M_dataplus._M_p != &local_918.field_2) {
      operator_delete(local_918._M_dataplus._M_p,local_918.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar2);
    std::__cxx11::string::operator=((string *)local_870,"OwnerId");
    std::__cxx11::string::operator=((string *)&local_850,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)&local_830,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_810,"ScalingGroupName");
    std::__cxx11::string::operator=((string *)&local_7f0,"MinSize");
    std::__cxx11::string::operator=((string *)&local_7d0,"MaxSize");
    std::__cxx11::string::operator=((string *)&local_7b0,"DefaultCooldown");
    std::__cxx11::string::operator=(local_790,"LoadBalancerId");
    std::__cxx11::string::operator=(local_770,"DBInstanceId.1");
    std::__cxx11::string::operator=(local_750,"DBInstanceId.2");
    std::__cxx11::string::operator=((string *)&local_730,"DBInstanceId.3");
    std::__cxx11::string::operator=((string *)&local_710,"RemovalPolicy.1");
    std::__cxx11::string::operator=((string *)&local_6f0,"RemovalPolicy.2");
    std::__cxx11::string::operator=((string *)&local_6d0,"OwnerAccount");
    aliyun::Ess::CreateScalingGroup
              ((EssCreateScalingGroupRequestType *)this,
               (EssCreateScalingGroupResponseType *)local_870,(EssErrorInfo *)local_8b8);
    HttpTestListener::WaitComplete(pHVar2);
    main_cold_3();
LAB_0010ac85:
    local_8f8.field_2._M_allocated_capacity._0_2_ = 0x3231;
    local_8f8.field_2._M_local_buf[2] = '7';
    local_8f8.field_2._M_allocated_capacity._3_4_ = 0x302e302e;
    local_8f8.field_2._M_local_buf[7] = '.';
    local_8f8.field_2._8_7_ = 0x34333232313a31;
    local_8f8._M_string_length = 0xf;
    local_8f8.field_2._M_local_buf[0xf] = '\0';
    local_8f8._M_dataplus._M_p = (pointer)&local_8f8.field_2;
    aliyun::Ess::SetProxyHost((Ess *)this,&local_8f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
      operator_delete(local_8f8._M_dataplus._M_p,
                      CONCAT17(local_8f8.field_2._M_local_buf[7],
                               CONCAT43(local_8f8.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_8f8.field_2._M_local_buf[2],
                                                 local_8f8.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar2 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar2,0x2fca);
    local_918._M_dataplus._M_p = (pointer)&local_918.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_918,
               "{  \"ScalingRuleId\": \"ScalingRuleId\",  \"ScalingRuleAri\": \"ScalingRuleAri\"}",
               "");
    HttpTestListener::SetResponseBody(pHVar2,&local_918);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_918._M_dataplus._M_p != &local_918.field_2) {
      operator_delete(local_918._M_dataplus._M_p,local_918.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar2);
    std::__cxx11::string::operator=((string *)local_870,"OwnerId");
    std::__cxx11::string::operator=((string *)&local_850,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)&local_830,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_810,"ScalingGroupId");
    std::__cxx11::string::operator=((string *)&local_7f0,"ScalingRuleName");
    std::__cxx11::string::operator=((string *)&local_7d0,"Cooldown");
    std::__cxx11::string::operator=((string *)&local_7b0,"AdjustmentType");
    std::__cxx11::string::operator=(local_790,"AdjustmentValue");
    std::__cxx11::string::operator=(local_770,"OwnerAccount");
    aliyun::Ess::CreateScalingRule
              ((EssCreateScalingRuleRequestType *)this,(EssCreateScalingRuleResponseType *)local_870
               ,(EssErrorInfo *)local_8b8);
    HttpTestListener::WaitComplete(pHVar2);
    main_cold_4();
LAB_0010ae2d:
    local_8f8.field_2._M_allocated_capacity._0_2_ = 0x3231;
    local_8f8.field_2._M_local_buf[2] = '7';
    local_8f8.field_2._M_allocated_capacity._3_4_ = 0x302e302e;
    local_8f8.field_2._M_local_buf[7] = '.';
    local_8f8.field_2._8_7_ = 0x34333232313a31;
    local_8f8._M_string_length = 0xf;
    local_8f8.field_2._M_local_buf[0xf] = '\0';
    local_8f8._M_dataplus._M_p = (pointer)&local_8f8.field_2;
    aliyun::Ess::SetProxyHost((Ess *)this,&local_8f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
      operator_delete(local_8f8._M_dataplus._M_p,
                      CONCAT17(local_8f8.field_2._M_local_buf[7],
                               CONCAT43(local_8f8.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_8f8.field_2._M_local_buf[2],
                                                 local_8f8.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar2 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar2,0x2fca);
    local_918._M_dataplus._M_p = (pointer)&local_918.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_918,"{  \"ScheduledTaskId\": \"ScheduledTaskId\"}","");
    HttpTestListener::SetResponseBody(pHVar2,&local_918);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_918._M_dataplus._M_p != &local_918.field_2) {
      operator_delete(local_918._M_dataplus._M_p,local_918.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar2);
    std::__cxx11::string::operator=((string *)local_870,"OwnerId");
    std::__cxx11::string::operator=((string *)&local_850,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)&local_830,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_810,"ScheduledTaskName");
    std::__cxx11::string::operator=((string *)&local_7f0,"Description");
    std::__cxx11::string::operator=((string *)&local_7d0,"ScheduledAction");
    std::__cxx11::string::operator=((string *)&local_7b0,"RecurrenceEndTime");
    std::__cxx11::string::operator=(local_790,"LaunchTime");
    std::__cxx11::string::operator=(local_770,"RecurrenceType");
    std::__cxx11::string::operator=(local_750,"RecurrenceValue");
    std::__cxx11::string::operator=((string *)&local_730,"TaskEnabled");
    std::__cxx11::string::operator=((string *)&local_710,"LaunchExpirationTime");
    std::__cxx11::string::operator=((string *)&local_6f0,"OwnerAccount");
    aliyun::Ess::CreateScheduledTask
              ((EssCreateScheduledTaskRequestType *)this,
               (EssCreateScheduledTaskResponseType *)local_870,(EssErrorInfo *)local_8b8);
    HttpTestListener::WaitComplete(pHVar2);
    main_cold_5();
LAB_0010b025:
    local_8d8.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_8d8.field_2._M_local_buf[7] = '.';
    local_8d8.field_2._M_local_buf[8] = '1';
    local_8d8.field_2._M_local_buf[9] = ':';
    local_8d8.field_2._10_5_ = 0x3433323231;
    local_8d8._M_string_length = 0xf;
    local_8d8.field_2._M_local_buf[0xf] = '\0';
    local_8d8._M_dataplus._M_p = (pointer)paVar3;
    aliyun::Ess::SetProxyHost((Ess *)this,&local_8d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8d8._M_dataplus._M_p != paVar3) {
      operator_delete(local_8d8._M_dataplus._M_p,
                      CONCAT17(local_8d8.field_2._M_local_buf[7],
                               local_8d8.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar2 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar2,0x2fca);
    local_8f8.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
    local_8f8._M_string_length = 2;
    local_8f8.field_2._M_local_buf[2] = '\0';
    local_8f8._M_dataplus._M_p = (pointer)&local_8f8.field_2;
    HttpTestListener::SetResponseBody(pHVar2,&local_8f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
      operator_delete(local_8f8._M_dataplus._M_p,
                      CONCAT17(local_8f8.field_2._M_local_buf[7],
                               CONCAT43(local_8f8.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_8f8.field_2._M_local_buf[2],
                                                 local_8f8.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    HttpTestListener::Start(pHVar2);
    std::__cxx11::string::operator=((string *)local_870,"OwnerId");
    std::__cxx11::string::operator=((string *)&local_850,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)&local_830,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_810,"ScalingConfigurationId");
    std::__cxx11::string::operator=((string *)&local_7f0,"OwnerAccount");
    aliyun::Ess::DeleteScalingConfiguration
              ((EssDeleteScalingConfigurationRequestType *)this,
               (EssDeleteScalingConfigurationResponseType *)local_870,(EssErrorInfo *)&local_918);
    HttpTestListener::WaitComplete(pHVar2);
    main_cold_6();
LAB_0010b176:
    local_8d8.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_8d8.field_2._M_local_buf[7] = '.';
    local_8d8.field_2._M_local_buf[8] = '1';
    local_8d8.field_2._M_local_buf[9] = ':';
    local_8d8.field_2._10_5_ = 0x3433323231;
    local_8d8._M_string_length = 0xf;
    local_8d8.field_2._M_local_buf[0xf] = '\0';
    local_8d8._M_dataplus._M_p = (pointer)paVar3;
    aliyun::Ess::SetProxyHost((Ess *)this,&local_8d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8d8._M_dataplus._M_p != paVar3) {
      operator_delete(local_8d8._M_dataplus._M_p,
                      CONCAT17(local_8d8.field_2._M_local_buf[7],
                               local_8d8.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar2 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar2,0x2fca);
    local_8f8.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
    local_8f8._M_string_length = 2;
    local_8f8.field_2._M_local_buf[2] = '\0';
    local_8f8._M_dataplus._M_p = (pointer)&local_8f8.field_2;
    HttpTestListener::SetResponseBody(pHVar2,&local_8f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
      operator_delete(local_8f8._M_dataplus._M_p,
                      CONCAT17(local_8f8.field_2._M_local_buf[7],
                               CONCAT43(local_8f8.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_8f8.field_2._M_local_buf[2],
                                                 local_8f8.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    HttpTestListener::Start(pHVar2);
    std::__cxx11::string::operator=((string *)local_870,"OwnerId");
    std::__cxx11::string::operator=((string *)&local_850,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)&local_830,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_810,"ScalingGroupId");
    std::__cxx11::string::operator=((string *)&local_7f0,"ForceDelete");
    std::__cxx11::string::operator=((string *)&local_7d0,"OwnerAccount");
    aliyun::Ess::DeleteScalingGroup
              ((EssDeleteScalingGroupRequestType *)this,
               (EssDeleteScalingGroupResponseType *)local_870,(EssErrorInfo *)&local_918);
    HttpTestListener::WaitComplete(pHVar2);
    main_cold_7();
LAB_0010b2db:
    local_8d8.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_8d8.field_2._M_local_buf[7] = '.';
    local_8d8.field_2._M_local_buf[8] = '1';
    local_8d8.field_2._M_local_buf[9] = ':';
    local_8d8.field_2._10_5_ = 0x3433323231;
    local_8d8._M_string_length = 0xf;
    local_8d8.field_2._M_local_buf[0xf] = '\0';
    local_8d8._M_dataplus._M_p = (pointer)paVar3;
    aliyun::Ess::SetProxyHost((Ess *)this,&local_8d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8d8._M_dataplus._M_p != paVar3) {
      operator_delete(local_8d8._M_dataplus._M_p,
                      CONCAT17(local_8d8.field_2._M_local_buf[7],
                               local_8d8.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar2 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar2,0x2fca);
    local_8f8.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
    local_8f8._M_string_length = 2;
    local_8f8.field_2._M_local_buf[2] = '\0';
    local_8f8._M_dataplus._M_p = (pointer)&local_8f8.field_2;
    HttpTestListener::SetResponseBody(pHVar2,&local_8f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
      operator_delete(local_8f8._M_dataplus._M_p,
                      CONCAT17(local_8f8.field_2._M_local_buf[7],
                               CONCAT43(local_8f8.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_8f8.field_2._M_local_buf[2],
                                                 local_8f8.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    HttpTestListener::Start(pHVar2);
    std::__cxx11::string::operator=((string *)local_870,"OwnerId");
    std::__cxx11::string::operator=((string *)&local_850,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)&local_830,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_810,"ScalingRuleId");
    std::__cxx11::string::operator=((string *)&local_7f0,"OwnerAccount");
    aliyun::Ess::DeleteScalingRule
              ((EssDeleteScalingRuleRequestType *)this,(EssDeleteScalingRuleResponseType *)local_870
               ,(EssErrorInfo *)&local_918);
    HttpTestListener::WaitComplete(pHVar2);
    main_cold_8();
LAB_0010b42c:
    local_8d8.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_8d8.field_2._M_local_buf[7] = '.';
    local_8d8.field_2._M_local_buf[8] = '1';
    local_8d8.field_2._M_local_buf[9] = ':';
    local_8d8.field_2._10_5_ = 0x3433323231;
    local_8d8._M_string_length = 0xf;
    local_8d8.field_2._M_local_buf[0xf] = '\0';
    local_8d8._M_dataplus._M_p = (pointer)paVar3;
    aliyun::Ess::SetProxyHost((Ess *)this,&local_8d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8d8._M_dataplus._M_p != paVar3) {
      operator_delete(local_8d8._M_dataplus._M_p,
                      CONCAT17(local_8d8.field_2._M_local_buf[7],
                               local_8d8.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar2 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar2,0x2fca);
    local_8f8.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
    local_8f8._M_string_length = 2;
    local_8f8.field_2._M_local_buf[2] = '\0';
    local_8f8._M_dataplus._M_p = (pointer)&local_8f8.field_2;
    HttpTestListener::SetResponseBody(pHVar2,&local_8f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
      operator_delete(local_8f8._M_dataplus._M_p,
                      CONCAT17(local_8f8.field_2._M_local_buf[7],
                               CONCAT43(local_8f8.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_8f8.field_2._M_local_buf[2],
                                                 local_8f8.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    HttpTestListener::Start(pHVar2);
    std::__cxx11::string::operator=((string *)local_870,"OwnerId");
    std::__cxx11::string::operator=((string *)&local_850,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)&local_830,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_810,"ScheduledTaskId");
    std::__cxx11::string::operator=((string *)&local_7f0,"OwnerAccount");
    aliyun::Ess::DeleteScheduledTask
              ((EssDeleteScheduledTaskRequestType *)this,
               (EssDeleteScheduledTaskResponseType *)local_870,(EssErrorInfo *)&local_918);
    HttpTestListener::WaitComplete(pHVar2);
    main_cold_9();
LAB_0010b57d:
    local_8f8.field_2._M_allocated_capacity._0_2_ = 0x3231;
    local_8f8.field_2._M_local_buf[2] = '7';
    local_8f8.field_2._M_allocated_capacity._3_4_ = 0x302e302e;
    local_8f8.field_2._M_local_buf[7] = '.';
    local_8f8.field_2._8_7_ = 0x34333232313a31;
    local_8f8._M_string_length = 0xf;
    local_8f8.field_2._M_local_buf[0xf] = '\0';
    local_8f8._M_dataplus._M_p = (pointer)&local_8f8.field_2;
    aliyun::Ess::SetProxyHost((Ess *)this,&local_8f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
      operator_delete(local_8f8._M_dataplus._M_p,
                      CONCAT17(local_8f8.field_2._M_local_buf[7],
                               CONCAT43(local_8f8.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_8f8.field_2._M_local_buf[2],
                                                 local_8f8.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar2 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar2,0x2fca);
    local_918._M_dataplus._M_p = (pointer)&local_918.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_918,
               "{  \"ScalingActivities\": {    \"ScalingActivity\": [      {        \"ScalingActivityId\": \"ScalingActivityId\",        \"ScalingGroupId\": \"ScalingGroupId\",        \"Description\": \"Description\",        \"Cause\": \"Cause\",        \"StartTime\": \"StartTime\",        \"EndTime\": \"EndTime\",        \"Progress\": 0,        \"StatusCode\": \"StatusCode\",        \"StatusMessage\": \"StatusMessage\"      }    ]  },  \"TotalCount\": 0,  \"PageNumber\": 0,  \"PageSize\": 0}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar2,&local_918);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_918._M_dataplus._M_p != &local_918.field_2) {
      operator_delete(local_918._M_dataplus._M_p,local_918.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar2);
    std::__cxx11::string::operator=((string *)local_870,"OwnerId");
    std::__cxx11::string::operator=((string *)&local_850,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)&local_830,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_810,"PageNumber");
    std::__cxx11::string::operator=((string *)&local_7f0,"PageSize");
    std::__cxx11::string::operator=((string *)&local_7d0,"ScalingGroupId");
    std::__cxx11::string::operator=((string *)&local_7b0,"StatusCode");
    std::__cxx11::string::operator=(local_790,"ScalingActivityId.1");
    std::__cxx11::string::operator=(local_770,"ScalingActivityId.2");
    std::__cxx11::string::operator=(local_750,"ScalingActivityId.3");
    std::__cxx11::string::operator=((string *)&local_730,"ScalingActivityId.4");
    std::__cxx11::string::operator=((string *)&local_710,"ScalingActivityId.5");
    std::__cxx11::string::operator=((string *)&local_6f0,"ScalingActivityId.6");
    std::__cxx11::string::operator=((string *)&local_6d0,"ScalingActivityId.7");
    std::__cxx11::string::operator=((string *)&local_6b0,"ScalingActivityId.8");
    std::__cxx11::string::operator=((string *)&local_690,"ScalingActivityId.9");
    std::__cxx11::string::operator=((string *)&local_670,"ScalingActivityId.10");
    std::__cxx11::string::operator=((string *)&local_650,"ScalingActivityId.11");
    std::__cxx11::string::operator=((string *)&local_630,"ScalingActivityId.12");
    std::__cxx11::string::operator=((string *)&local_610,"ScalingActivityId.13");
    std::__cxx11::string::operator=((string *)&local_5f0,"ScalingActivityId.14");
    std::__cxx11::string::operator=((string *)&local_5d0,"ScalingActivityId.15");
    std::__cxx11::string::operator=((string *)&local_5b0,"ScalingActivityId.16");
    std::__cxx11::string::operator=((string *)&local_590,"ScalingActivityId.17");
    std::__cxx11::string::operator=((string *)&local_570,"ScalingActivityId.18");
    std::__cxx11::string::operator=((string *)&local_550,"ScalingActivityId.19");
    std::__cxx11::string::operator=((string *)&local_530,"ScalingActivityId.20");
    std::__cxx11::string::operator=((string *)&local_510,"OwnerAccount");
    aliyun::Ess::DescribeScalingActivities
              ((EssDescribeScalingActivitiesRequestType *)this,
               (EssDescribeScalingActivitiesResponseType *)local_870,(EssErrorInfo *)local_8b8);
    HttpTestListener::WaitComplete(pHVar2);
    main_cold_10();
LAB_0010b8a1:
    local_8f8.field_2._M_allocated_capacity._0_2_ = 0x3231;
    local_8f8.field_2._M_local_buf[2] = '7';
    local_8f8.field_2._M_allocated_capacity._3_4_ = 0x302e302e;
    local_8f8.field_2._M_local_buf[7] = '.';
    local_8f8.field_2._8_7_ = 0x34333232313a31;
    local_8f8._M_string_length = 0xf;
    local_8f8.field_2._M_local_buf[0xf] = '\0';
    local_8f8._M_dataplus._M_p = (pointer)&local_8f8.field_2;
    aliyun::Ess::SetProxyHost((Ess *)this,&local_8f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
      operator_delete(local_8f8._M_dataplus._M_p,
                      CONCAT17(local_8f8.field_2._M_local_buf[7],
                               CONCAT43(local_8f8.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_8f8.field_2._M_local_buf[2],
                                                 local_8f8.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar2 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar2,0x2fca);
    local_918._M_dataplus._M_p = (pointer)&local_918.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_918,
               "{  \"ScalingConfigurations\": {    \"ScalingConfiguration\": [      {        \"DataDisks\": {          \"DataDisk\": [            {              \"Size\": 0,              \"Category\": \"Category\",              \"SnapshotId\": \"SnapshotId\",              \"Device\": \"Device\"            }          ]        },        \"ScalingConfigurationId\": \"ScalingConfigurationId\",        \"ScalingConfigurationName\": \"ScalingConfigurationName\",        \"ScalingGroupId\": \"ScalingGroupId\",        \"ImageId\": \"ImageId\",        \"InstanceType\": \"InstanceType\",        \"SecurityGroupId\": \"SecurityGroupId\",        \"InternetChargeType\": \"InternetChargeType\",        \"InternetMaxBandwidthIn\": 0,        \"InternetMaxBandwidthOut\": 0,        \"SystemDiskCategory\": \"SystemDiskCategory\",        \"LifecycleState\": \"LifecycleState\",        \"CreationTime\": \"CreationTime\"      }    ]  },  \"TotalCount\": 0,  \"PageNumber\": 0,  \"PageSize\": 0}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar2,&local_918);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_918._M_dataplus._M_p != &local_918.field_2) {
      operator_delete(local_918._M_dataplus._M_p,local_918.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar2);
    std::__cxx11::string::operator=((string *)local_870,"OwnerId");
    std::__cxx11::string::operator=((string *)&local_850,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)&local_830,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_810,"PageNumber");
    std::__cxx11::string::operator=((string *)&local_7f0,"PageSize");
    std::__cxx11::string::operator=((string *)&local_7d0,"ScalingGroupId");
    std::__cxx11::string::operator=((string *)&local_7b0,"ScalingConfigurationId.1");
    std::__cxx11::string::operator=(local_790,"ScalingConfigurationId.2");
    std::__cxx11::string::operator=(local_770,"ScalingConfigurationId.3");
    std::__cxx11::string::operator=(local_750,"ScalingConfigurationId.4");
    std::__cxx11::string::operator=((string *)&local_730,"ScalingConfigurationId.5");
    std::__cxx11::string::operator=((string *)&local_710,"ScalingConfigurationId.6");
    std::__cxx11::string::operator=((string *)&local_6f0,"ScalingConfigurationId.7");
    std::__cxx11::string::operator=((string *)&local_6d0,"ScalingConfigurationId.8");
    std::__cxx11::string::operator=((string *)&local_6b0,"ScalingConfigurationId.9");
    std::__cxx11::string::operator=((string *)&local_690,"ScalingConfigurationId.10");
    std::__cxx11::string::operator=((string *)&local_670,"ScalingConfigurationName.1");
    std::__cxx11::string::operator=((string *)&local_650,"ScalingConfigurationName.2");
    std::__cxx11::string::operator=((string *)&local_630,"ScalingConfigurationName.3");
    std::__cxx11::string::operator=((string *)&local_610,"ScalingConfigurationName.4");
    std::__cxx11::string::operator=((string *)&local_5f0,"ScalingConfigurationName.5");
    std::__cxx11::string::operator=((string *)&local_5d0,"ScalingConfigurationName.6");
    std::__cxx11::string::operator=((string *)&local_5b0,"ScalingConfigurationName.7");
    std::__cxx11::string::operator=((string *)&local_590,"ScalingConfigurationName.8");
    std::__cxx11::string::operator=((string *)&local_570,"ScalingConfigurationName.9");
    std::__cxx11::string::operator=((string *)&local_550,"ScalingConfigurationName.10");
    std::__cxx11::string::operator=((string *)&local_530,"OwnerAccount");
    aliyun::Ess::DescribeScalingConfigurations
              ((EssDescribeScalingConfigurationsRequestType *)this,
               (EssDescribeScalingConfigurationsResponseType *)local_870,(EssErrorInfo *)local_8b8);
    HttpTestListener::WaitComplete(pHVar2);
    main_cold_11();
LAB_0010bbb1:
    local_8f8.field_2._M_allocated_capacity._0_2_ = 0x3231;
    local_8f8.field_2._M_local_buf[2] = '7';
    local_8f8.field_2._M_allocated_capacity._3_4_ = 0x302e302e;
    local_8f8.field_2._M_local_buf[7] = '.';
    local_8f8.field_2._8_7_ = 0x34333232313a31;
    local_8f8._M_string_length = 0xf;
    local_8f8.field_2._M_local_buf[0xf] = '\0';
    local_8f8._M_dataplus._M_p = (pointer)&local_8f8.field_2;
    aliyun::Ess::SetProxyHost((Ess *)this,&local_8f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
      operator_delete(local_8f8._M_dataplus._M_p,
                      CONCAT17(local_8f8.field_2._M_local_buf[7],
                               CONCAT43(local_8f8.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_8f8.field_2._M_local_buf[2],
                                                 local_8f8.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar2 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar2,0x2fca);
    local_918._M_dataplus._M_p = (pointer)&local_918.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_918,
               "{  \"ScalingGroups\": {    \"ScalingGroup\": [      {        \"RemovalPolicies\": {          \"RemovalPolicy\": [            \"RemovalPolicy\"          ]        },        \"DBInstanceIds\": {          \"DBInstanceId\": [            \"DBInstanceId\"          ]        },        \"DefaultCooldown\": 0,        \"MaxSize\": 0,        \"PendingCapacity\": 0,        \"LoadBalancerId\": \"LoadBalancerId\",        \"RemovingCapacity\": 0,        \"ScalingGroupName\": \"ScalingGroupName\",        \"ActiveCapacity\": 0,        \"ActiveScalingConfigurationId\": \"ActiveScalingConfigurationId\",        \"ScalingGroupId\": \"ScalingGroupId\",        \"RegionId\": \"RegionId\",        \"TotalCapacity\": 0,        \"MinSize\": 0,        \"LifecycleState\": \"LifecycleState\",        \"CreationTime\": \"CreationTime\"      }    ]  },  \"TotalCount\": 0,  \"PageNumber\": 0,  \"PageSize\": 0}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar2,&local_918);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_918._M_dataplus._M_p != &local_918.field_2) {
      operator_delete(local_918._M_dataplus._M_p,local_918.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar2);
    std::__cxx11::string::operator=((string *)local_870,"OwnerId");
    std::__cxx11::string::operator=((string *)&local_850,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)&local_830,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_810,"PageNumber");
    std::__cxx11::string::operator=((string *)&local_7f0,"PageSize");
    std::__cxx11::string::operator=((string *)&local_7d0,"ScalingGroupId.1");
    std::__cxx11::string::operator=((string *)&local_7b0,"ScalingGroupId.2");
    std::__cxx11::string::operator=(local_790,"ScalingGroupId.3");
    std::__cxx11::string::operator=(local_770,"ScalingGroupId.4");
    std::__cxx11::string::operator=(local_750,"ScalingGroupId.5");
    std::__cxx11::string::operator=((string *)&local_730,"ScalingGroupId.6");
    std::__cxx11::string::operator=((string *)&local_710,"ScalingGroupId.7");
    std::__cxx11::string::operator=((string *)&local_6f0,"ScalingGroupId.8");
    std::__cxx11::string::operator=((string *)&local_6d0,"ScalingGroupId.9");
    std::__cxx11::string::operator=((string *)&local_6b0,"ScalingGroupId.10");
    std::__cxx11::string::operator=((string *)&local_690,"ScalingGroupId.12");
    std::__cxx11::string::operator=((string *)&local_670,"ScalingGroupId.13");
    std::__cxx11::string::operator=((string *)&local_650,"ScalingGroupId.14");
    std::__cxx11::string::operator=((string *)&local_630,"ScalingGroupId.15");
    std::__cxx11::string::operator=((string *)&local_610,"ScalingGroupId.16");
    std::__cxx11::string::operator=((string *)&local_5f0,"ScalingGroupId.17");
    std::__cxx11::string::operator=((string *)&local_5d0,"ScalingGroupId.18");
    std::__cxx11::string::operator=((string *)&local_5b0,"ScalingGroupId.19");
    std::__cxx11::string::operator=((string *)&local_590,"ScalingGroupId.20");
    std::__cxx11::string::operator=((string *)&local_570,"ScalingGroupName.1");
    std::__cxx11::string::operator=((string *)&local_550,"ScalingGroupName.2");
    std::__cxx11::string::operator=((string *)&local_530,"ScalingGroupName.3");
    std::__cxx11::string::operator=((string *)&local_510,"ScalingGroupName.4");
    std::__cxx11::string::operator=((string *)&local_4f0,"ScalingGroupName.5");
    std::__cxx11::string::operator=((string *)&local_4d0,"ScalingGroupName.6");
    std::__cxx11::string::operator=((string *)&local_4b0,"ScalingGroupName.7");
    std::__cxx11::string::operator=((string *)&local_490,"ScalingGroupName.8");
    std::__cxx11::string::operator=((string *)&local_470,"ScalingGroupName.9");
    std::__cxx11::string::operator=((string *)&local_450,"ScalingGroupName.10");
    std::__cxx11::string::operator=((string *)&local_430,"ScalingGroupName.11");
    std::__cxx11::string::operator=((string *)&local_410,"ScalingGroupName.12");
    std::__cxx11::string::operator=((string *)&local_3f0,"ScalingGroupName.13");
    std::__cxx11::string::operator=((string *)&local_3d0,"ScalingGroupName.14");
    std::__cxx11::string::operator=((string *)&local_3b0,"ScalingGroupName.15");
    std::__cxx11::string::operator=((string *)&local_390,"ScalingGroupName.16");
    std::__cxx11::string::operator=((string *)&local_370,"ScalingGroupName.17");
    std::__cxx11::string::operator=((string *)&local_350,"ScalingGroupName.18");
    std::__cxx11::string::operator=((string *)&local_330,"ScalingGroupName.19");
    std::__cxx11::string::operator=((string *)&local_310,"ScalingGroupName.20");
    std::__cxx11::string::operator=((string *)&local_2f0,"OwnerAccount");
    aliyun::Ess::DescribeScalingGroups
              ((EssDescribeScalingGroupsRequestType *)this,
               (EssDescribeScalingGroupsResponseType *)local_870,(EssErrorInfo *)local_8b8);
    HttpTestListener::WaitComplete(pHVar2);
    main_cold_12();
LAB_0010c029:
    local_8f8.field_2._M_allocated_capacity._0_2_ = 0x3231;
    local_8f8.field_2._M_local_buf[2] = '7';
    local_8f8.field_2._M_allocated_capacity._3_4_ = 0x302e302e;
    local_8f8.field_2._M_local_buf[7] = '.';
    local_8f8.field_2._8_7_ = 0x34333232313a31;
    local_8f8._M_string_length = 0xf;
    local_8f8.field_2._M_local_buf[0xf] = '\0';
    local_8f8._M_dataplus._M_p = (pointer)&local_8f8.field_2;
    aliyun::Ess::SetProxyHost((Ess *)this,&local_8f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
      operator_delete(local_8f8._M_dataplus._M_p,
                      CONCAT17(local_8f8.field_2._M_local_buf[7],
                               CONCAT43(local_8f8.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_8f8.field_2._M_local_buf[2],
                                                 local_8f8.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar2 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar2,0x2fca);
    local_918._M_dataplus._M_p = (pointer)&local_918.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_918,
               "{  \"ScalingInstances\": {    \"ScalingInstance\": [      {        \"InstanceId\": \"InstanceId\",        \"ScalingConfigurationId\": \"ScalingConfigurationId\",        \"ScalingGroupId\": \"ScalingGroupId\",        \"HealthStatus\": \"HealthStatus\",        \"LifecycleState\": \"LifecycleState\",        \"CreationTime\": \"CreationTime\",        \"CreationType\": \"CreationType\"      }    ]  },  \"TotalCount\": 0,  \"PageNumber\": 0,  \"PageSize\": 0}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar2,&local_918);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_918._M_dataplus._M_p != &local_918.field_2) {
      operator_delete(local_918._M_dataplus._M_p,local_918.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar2);
    std::__cxx11::string::operator=((string *)local_870,"OwnerId");
    std::__cxx11::string::operator=((string *)&local_850,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)&local_830,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_810,"ScalingGroupId");
    std::__cxx11::string::operator=((string *)&local_7f0,"ScalingConfigurationId");
    std::__cxx11::string::operator=((string *)&local_7d0,"HealthStatus");
    std::__cxx11::string::operator=((string *)&local_7b0,"LifecycleState");
    std::__cxx11::string::operator=(local_790,"CreationType");
    std::__cxx11::string::operator=(local_770,"PageNumber");
    std::__cxx11::string::operator=(local_750,"PageSize");
    std::__cxx11::string::operator=((string *)&local_730,"InstanceId.1");
    std::__cxx11::string::operator=((string *)&local_710,"InstanceId.2");
    std::__cxx11::string::operator=((string *)&local_6f0,"InstanceId.3");
    std::__cxx11::string::operator=((string *)&local_6d0,"InstanceId.4");
    std::__cxx11::string::operator=((string *)&local_6b0,"InstanceId.5");
    std::__cxx11::string::operator=((string *)&local_690,"InstanceId.6");
    std::__cxx11::string::operator=((string *)&local_670,"InstanceId.7");
    std::__cxx11::string::operator=((string *)&local_650,"InstanceId.8");
    std::__cxx11::string::operator=((string *)&local_630,"InstanceId.9");
    std::__cxx11::string::operator=((string *)&local_610,"InstanceId.10");
    std::__cxx11::string::operator=((string *)&local_5f0,"InstanceId.11");
    std::__cxx11::string::operator=((string *)&local_5d0,"InstanceId.12");
    std::__cxx11::string::operator=((string *)&local_5b0,"InstanceId.13");
    std::__cxx11::string::operator=((string *)&local_590,"InstanceId.14");
    std::__cxx11::string::operator=((string *)&local_570,"InstanceId.15");
    std::__cxx11::string::operator=((string *)&local_550,"InstanceId.16");
    std::__cxx11::string::operator=((string *)&local_530,"InstanceId.17");
    std::__cxx11::string::operator=((string *)&local_510,"InstanceId.18");
    std::__cxx11::string::operator=((string *)&local_4f0,"InstanceId.19");
    std::__cxx11::string::operator=((string *)&local_4d0,"InstanceId.20");
    std::__cxx11::string::operator=((string *)&local_4b0,"OwnerAccount");
    aliyun::Ess::DescribeScalingInstances
              ((EssDescribeScalingInstancesRequestType *)this,
               (EssDescribeScalingInstancesResponseType *)local_870,(EssErrorInfo *)local_8b8);
    HttpTestListener::WaitComplete(pHVar2);
    main_cold_13();
    paVar4 = paVar3;
LAB_0010c389:
    local_8f8.field_2._M_allocated_capacity._0_2_ = 0x3231;
    local_8f8.field_2._M_local_buf[2] = '7';
    local_8f8.field_2._M_allocated_capacity._3_4_ = 0x302e302e;
    local_8f8.field_2._M_local_buf[7] = '.';
    local_8f8.field_2._8_7_ = 0x34333232313a31;
    local_8f8._M_string_length = 0xf;
    local_8f8.field_2._M_local_buf[0xf] = '\0';
    local_8f8._M_dataplus._M_p = (pointer)&local_8f8.field_2;
    aliyun::Ess::SetProxyHost((Ess *)this,&local_8f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
      operator_delete(local_8f8._M_dataplus._M_p,
                      CONCAT17(local_8f8.field_2._M_local_buf[7],
                               CONCAT43(local_8f8.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_8f8.field_2._M_local_buf[2],
                                                 local_8f8.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar2 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar2,0x2fca);
    local_918._M_dataplus._M_p = (pointer)&local_918.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_918,
               "{  \"ScalingRules\": {    \"ScalingRule\": [      {        \"ScalingRuleId\": \"ScalingRuleId\",        \"ScalingGroupId\": \"ScalingGroupId\",        \"ScalingRuleName\": \"ScalingRuleName\",        \"Cooldown\": 0,        \"AdjustmentType\": \"AdjustmentType\",        \"AdjustmentValue\": 0,        \"MinSize\": 0,        \"MaxSize\": 0,        \"ScalingRuleAri\": \"ScalingRuleAri\"      }    ]  },  \"TotalCount\": 0,  \"PageNumber\": 0,  \"PageSize\": 0}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar2,&local_918);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_918._M_dataplus._M_p != &local_918.field_2) {
      operator_delete(local_918._M_dataplus._M_p,local_918.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar2);
    std::__cxx11::string::operator=((string *)local_870,"OwnerId");
    std::__cxx11::string::operator=((string *)&local_850,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)&local_830,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_810,"PageNumber");
    std::__cxx11::string::operator=((string *)&local_7f0,"PageSize");
    std::__cxx11::string::operator=((string *)&local_7d0,"ScalingGroupId");
    std::__cxx11::string::operator=((string *)&local_7b0,"ScalingRuleId.1");
    std::__cxx11::string::operator=(local_790,"ScalingRuleId.2");
    std::__cxx11::string::operator=(local_770,"ScalingRuleId.3");
    std::__cxx11::string::operator=(local_750,"ScalingRuleId.4");
    std::__cxx11::string::operator=((string *)&local_730,"ScalingRuleId.5");
    std::__cxx11::string::operator=((string *)&local_710,"ScalingRuleId.6");
    std::__cxx11::string::operator=((string *)&local_6f0,"ScalingRuleId.7");
    std::__cxx11::string::operator=((string *)&local_6d0,"ScalingRuleId.8");
    std::__cxx11::string::operator=((string *)&local_6b0,"ScalingRuleId.9");
    std::__cxx11::string::operator=((string *)&local_690,"ScalingRuleId.10");
    std::__cxx11::string::operator=((string *)&local_670,"ScalingRuleName.1");
    std::__cxx11::string::operator=((string *)&local_650,"ScalingRuleName.2");
    std::__cxx11::string::operator=((string *)&local_630,"ScalingRuleName.3");
    std::__cxx11::string::operator=((string *)&local_610,"ScalingRuleName.4");
    std::__cxx11::string::operator=((string *)&local_5f0,"ScalingRuleName.5");
    std::__cxx11::string::operator=((string *)&local_5d0,"ScalingRuleName.6");
    std::__cxx11::string::operator=((string *)&local_5b0,"ScalingRuleName.7");
    std::__cxx11::string::operator=((string *)&local_590,"ScalingRuleName.8");
    std::__cxx11::string::operator=((string *)&local_570,"ScalingRuleName.9");
    std::__cxx11::string::operator=((string *)&local_550,"ScalingRuleName.10");
    std::__cxx11::string::operator=((string *)&local_530,"ScalingRuleAri.1");
    std::__cxx11::string::operator=((string *)&local_510,"ScalingRuleAri.2");
    std::__cxx11::string::operator=((string *)&local_4f0,"ScalingRuleAri.3");
    std::__cxx11::string::operator=((string *)&local_4d0,"ScalingRuleAri.4");
    std::__cxx11::string::operator=((string *)&local_4b0,"ScalingRuleAri.5");
    std::__cxx11::string::operator=((string *)&local_490,"ScalingRuleAri.6");
    std::__cxx11::string::operator=((string *)&local_470,"ScalingRuleAri.7");
    std::__cxx11::string::operator=((string *)&local_450,"ScalingRuleAri.8");
    std::__cxx11::string::operator=((string *)&local_430,"ScalingRuleAri.9");
    std::__cxx11::string::operator=((string *)&local_410,"ScalingRuleAri.10");
    std::__cxx11::string::operator=((string *)&local_3f0,"OwnerAccount");
    aliyun::Ess::DescribeScalingRules
              ((EssDescribeScalingRulesRequestType *)this,
               (EssDescribeScalingRulesResponseType *)local_870,(EssErrorInfo *)local_8b8);
    HttpTestListener::WaitComplete(pHVar2);
    main_cold_14();
LAB_0010c761:
    local_8f8.field_2._M_allocated_capacity._0_2_ = 0x3231;
    local_8f8.field_2._M_local_buf[2] = '7';
    local_8f8.field_2._M_allocated_capacity._3_4_ = 0x302e302e;
    local_8f8.field_2._M_local_buf[7] = '.';
    local_8f8.field_2._8_7_ = 0x34333232313a31;
    local_8f8._M_string_length = 0xf;
    local_8f8.field_2._M_local_buf[0xf] = '\0';
    local_8f8._M_dataplus._M_p = (pointer)&local_8f8.field_2;
    aliyun::Ess::SetProxyHost((Ess *)this,&local_8f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
      operator_delete(local_8f8._M_dataplus._M_p,
                      CONCAT17(local_8f8.field_2._M_local_buf[7],
                               CONCAT43(local_8f8.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_8f8.field_2._M_local_buf[2],
                                                 local_8f8.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar2 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar2,0x2fca);
    local_918._M_dataplus._M_p = (pointer)&local_918.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_918,
               "{  \"ScheduledTasks\": {    \"ScheduledTask\": [      {        \"ScheduledTaskId\": \"ScheduledTaskId\",        \"ScheduledTaskName\": \"ScheduledTaskName\",        \"Description\": \"Description\",        \"ScheduledAction\": \"ScheduledAction\",        \"RecurrenceEndTime\": \"RecurrenceEndTime\",        \"LaunchTime\": \"LaunchTime\",        \"RecurrenceType\": \"RecurrenceType\",        \"RecurrenceValue\": \"RecurrenceValue\",        \"LaunchExpirationTime\": 0,        \"TaskEnabled\": true      }    ]  },  \"TotalCount\": 0,  \"PageNumber\": 0,  \"PageSize\": 0}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar2,&local_918);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_918._M_dataplus._M_p != &local_918.field_2) {
      operator_delete(local_918._M_dataplus._M_p,local_918.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar2);
    std::__cxx11::string::operator=((string *)local_870,"OwnerId");
    std::__cxx11::string::operator=((string *)&local_850,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)&local_830,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_810,"PageNumber");
    std::__cxx11::string::operator=((string *)&local_7f0,"PageSize");
    std::__cxx11::string::operator=((string *)&local_7d0,"ScheduledAction.1");
    std::__cxx11::string::operator=((string *)&local_7b0,"ScheduledAction.2");
    std::__cxx11::string::operator=(local_790,"ScheduledAction.3");
    std::__cxx11::string::operator=(local_770,"ScheduledAction.4");
    std::__cxx11::string::operator=(local_750,"ScheduledAction.5");
    std::__cxx11::string::operator=((string *)&local_730,"ScheduledAction.6");
    std::__cxx11::string::operator=((string *)&local_710,"ScheduledAction.7");
    std::__cxx11::string::operator=((string *)&local_6f0,"ScheduledAction.8");
    std::__cxx11::string::operator=((string *)&local_6d0,"ScheduledAction.9");
    std::__cxx11::string::operator=((string *)&local_6b0,"ScheduledAction.10");
    std::__cxx11::string::operator=((string *)&local_690,"ScheduledAction.11");
    std::__cxx11::string::operator=((string *)&local_670,"ScheduledAction.12");
    std::__cxx11::string::operator=((string *)&local_650,"ScheduledAction.13");
    std::__cxx11::string::operator=((string *)&local_630,"ScheduledAction.14");
    std::__cxx11::string::operator=((string *)&local_610,"ScheduledAction.15");
    std::__cxx11::string::operator=((string *)&local_5f0,"ScheduledAction.16");
    std::__cxx11::string::operator=((string *)&local_5d0,"ScheduledAction.17");
    std::__cxx11::string::operator=((string *)&local_5b0,"ScheduledAction.18");
    std::__cxx11::string::operator=((string *)&local_590,"ScheduledAction.19");
    std::__cxx11::string::operator=((string *)&local_570,"ScheduledAction.20");
    std::__cxx11::string::operator=((string *)&local_550,"ScheduledTaskId.1");
    std::__cxx11::string::operator=((string *)&local_530,"ScheduledTaskId.2");
    std::__cxx11::string::operator=((string *)&local_510,"ScheduledTaskId.3");
    std::__cxx11::string::operator=((string *)&local_4f0,"ScheduledTaskId.4");
    std::__cxx11::string::operator=((string *)&local_4d0,"ScheduledTaskId.5");
    std::__cxx11::string::operator=((string *)&local_4b0,"ScheduledTaskId.6");
    std::__cxx11::string::operator=((string *)&local_490,"ScheduledTaskId.7");
    std::__cxx11::string::operator=((string *)&local_470,"ScheduledTaskId.8");
    std::__cxx11::string::operator=((string *)&local_450,"ScheduledTaskId.9");
    std::__cxx11::string::operator=((string *)&local_430,"ScheduledTaskId.10");
    std::__cxx11::string::operator=((string *)&local_410,"ScheduledTaskId.11");
    std::__cxx11::string::operator=((string *)&local_3f0,"ScheduledTaskId.12");
    std::__cxx11::string::operator=((string *)&local_3d0,"ScheduledTaskId.13");
    std::__cxx11::string::operator=((string *)&local_3b0,"ScheduledTaskId.14");
    std::__cxx11::string::operator=((string *)&local_390,"ScheduledTaskId.15");
    std::__cxx11::string::operator=((string *)&local_370,"ScheduledTaskId.16");
    std::__cxx11::string::operator=((string *)&local_350,"ScheduledTaskId.17");
    std::__cxx11::string::operator=((string *)&local_330,"ScheduledTaskId.18");
    std::__cxx11::string::operator=((string *)&local_310,"ScheduledTaskId.19");
    std::__cxx11::string::operator=((string *)&local_2f0,"ScheduledTaskId.20");
    std::__cxx11::string::operator=((string *)&local_2d0,"ScheduledTaskName.1");
    std::__cxx11::string::operator=((string *)&local_2b0,"ScheduledTaskName.2");
    std::__cxx11::string::operator=((string *)&local_290,"ScheduledTaskName.3");
    std::__cxx11::string::operator=((string *)&local_270,"ScheduledTaskName.4");
    std::__cxx11::string::operator=((string *)&local_250,"ScheduledTaskName.5");
    std::__cxx11::string::operator=((string *)&local_230,"ScheduledTaskName.6");
    std::__cxx11::string::operator=((string *)&local_210,"ScheduledTaskName.7");
    std::__cxx11::string::operator=((string *)&local_1f0,"ScheduledTaskName.8");
    std::__cxx11::string::operator=((string *)&local_1d0,"ScheduledTaskName.9");
    std::__cxx11::string::operator=((string *)&local_1b0,"ScheduledTaskName.10");
    std::__cxx11::string::operator=((string *)&local_190,"ScheduledTaskName.11");
    std::__cxx11::string::operator=((string *)&local_170,"ScheduledTaskName.12");
    std::__cxx11::string::operator=((string *)&local_150,"ScheduledTaskName.13");
    std::__cxx11::string::operator=((string *)&local_130,"ScheduledTaskName.14");
    std::__cxx11::string::operator=((string *)&local_110,"ScheduledTaskName.15");
    std::__cxx11::string::operator=((string *)&local_f0,"ScheduledTaskName.16");
    std::__cxx11::string::operator=((string *)&local_d0,"ScheduledTaskName.17");
    std::__cxx11::string::operator=((string *)&local_b0,"ScheduledTaskName.18");
    std::__cxx11::string::operator=((string *)&local_90,"ScheduledTaskName.19");
    std::__cxx11::string::operator=((string *)&local_70,"ScheduledTaskName.20");
    std::__cxx11::string::operator=((string *)&local_50,"OwnerAccount");
    aliyun::Ess::DescribeScheduledTasks
              (this,(EssDescribeScheduledTasksResponseType *)local_870,(EssErrorInfo *)local_8b8);
    HttpTestListener::WaitComplete(pHVar2);
    main_cold_15();
LAB_0010cd7d:
    local_8f8.field_2._M_allocated_capacity._0_2_ = 0x3231;
    local_8f8.field_2._M_local_buf[2] = '7';
    local_8f8.field_2._M_allocated_capacity._3_4_ = 0x302e302e;
    local_8f8.field_2._M_local_buf[7] = '.';
    local_8f8.field_2._8_7_ = 0x34333232313a31;
    local_8f8._M_string_length = 0xf;
    local_8f8.field_2._M_local_buf[0xf] = '\0';
    local_8f8._M_dataplus._M_p = (pointer)&local_8f8.field_2;
    aliyun::Ess::SetProxyHost((Ess *)this,&local_8f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
      operator_delete(local_8f8._M_dataplus._M_p,
                      CONCAT17(local_8f8.field_2._M_local_buf[7],
                               CONCAT43(local_8f8.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_8f8.field_2._M_local_buf[2],
                                                 local_8f8.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar2 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar2,0x2fca);
    local_918._M_dataplus._M_p = (pointer)&local_918.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_918,"{  \"ScalingActivityId\": \"ScalingActivityId\"}","");
    HttpTestListener::SetResponseBody(pHVar2,&local_918);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_918._M_dataplus._M_p != &local_918.field_2) {
      operator_delete(local_918._M_dataplus._M_p,local_918.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar2);
    std::__cxx11::string::operator=((string *)local_870,"OwnerId");
    std::__cxx11::string::operator=((string *)&local_850,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)&local_830,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_810,"ScalingGroupId");
    std::__cxx11::string::operator=((string *)&local_7f0,"InstanceId.1");
    std::__cxx11::string::operator=((string *)&local_7d0,"InstanceId.2");
    std::__cxx11::string::operator=((string *)&local_7b0,"InstanceId.3");
    std::__cxx11::string::operator=(local_790,"InstanceId.4");
    std::__cxx11::string::operator=(local_770,"InstanceId.5");
    std::__cxx11::string::operator=(local_750,"InstanceId.6");
    std::__cxx11::string::operator=((string *)&local_730,"InstanceId.7");
    std::__cxx11::string::operator=((string *)&local_710,"InstanceId.8");
    std::__cxx11::string::operator=((string *)&local_6f0,"InstanceId.9");
    std::__cxx11::string::operator=((string *)&local_6d0,"InstanceId.10");
    std::__cxx11::string::operator=((string *)&local_6b0,"InstanceId.11");
    std::__cxx11::string::operator=((string *)&local_690,"InstanceId.12");
    std::__cxx11::string::operator=((string *)&local_670,"InstanceId.13");
    std::__cxx11::string::operator=((string *)&local_650,"InstanceId.14");
    std::__cxx11::string::operator=((string *)&local_630,"InstanceId.15");
    std::__cxx11::string::operator=((string *)&local_610,"InstanceId.16");
    std::__cxx11::string::operator=((string *)&local_5f0,"InstanceId.17");
    std::__cxx11::string::operator=((string *)&local_5d0,"InstanceId.18");
    std::__cxx11::string::operator=((string *)&local_5b0,"InstanceId.19");
    std::__cxx11::string::operator=((string *)&local_590,"InstanceId.20");
    std::__cxx11::string::operator=((string *)&local_570,"OwnerAccount");
    aliyun::Ess::DetachInstances
              ((EssDetachInstancesRequestType *)this,(EssDetachInstancesResponseType *)local_870,
               (EssErrorInfo *)local_8b8);
    HttpTestListener::WaitComplete(pHVar2);
    main_cold_16();
LAB_0010d065:
    local_8d8.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_8d8.field_2._M_local_buf[7] = '.';
    local_8d8.field_2._M_local_buf[8] = '1';
    local_8d8.field_2._M_local_buf[9] = ':';
    local_8d8.field_2._10_5_ = 0x3433323231;
    local_8d8._M_string_length = 0xf;
    local_8d8.field_2._M_local_buf[0xf] = '\0';
    local_8d8._M_dataplus._M_p = (pointer)paVar4;
    aliyun::Ess::SetProxyHost((Ess *)this,&local_8d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8d8._M_dataplus._M_p != paVar4) {
      operator_delete(local_8d8._M_dataplus._M_p,
                      CONCAT17(local_8d8.field_2._M_local_buf[7],
                               local_8d8.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar2 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar2,0x2fca);
    local_8f8.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
    local_8f8._M_string_length = 2;
    local_8f8.field_2._M_local_buf[2] = '\0';
    local_8f8._M_dataplus._M_p = (pointer)&local_8f8.field_2;
    HttpTestListener::SetResponseBody(pHVar2,&local_8f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
      operator_delete(local_8f8._M_dataplus._M_p,
                      CONCAT17(local_8f8.field_2._M_local_buf[7],
                               CONCAT43(local_8f8.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_8f8.field_2._M_local_buf[2],
                                                 local_8f8.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    HttpTestListener::Start(pHVar2);
    std::__cxx11::string::operator=((string *)local_870,"OwnerId");
    std::__cxx11::string::operator=((string *)&local_850,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)&local_830,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_810,"ScalingGroupId");
    std::__cxx11::string::operator=((string *)&local_7f0,"OwnerAccount");
    aliyun::Ess::DisableScalingGroup
              ((EssDisableScalingGroupRequestType *)this,
               (EssDisableScalingGroupResponseType *)local_870,(EssErrorInfo *)&local_918);
    HttpTestListener::WaitComplete(pHVar2);
    main_cold_17();
LAB_0010d1b6:
    local_8d8.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_8d8.field_2._M_local_buf[7] = '.';
    local_8d8.field_2._M_local_buf[8] = '1';
    local_8d8.field_2._M_local_buf[9] = ':';
    local_8d8.field_2._10_5_ = 0x3433323231;
    local_8d8._M_string_length = 0xf;
    local_8d8.field_2._M_local_buf[0xf] = '\0';
    local_8d8._M_dataplus._M_p = (pointer)paVar4;
    aliyun::Ess::SetProxyHost((Ess *)this,&local_8d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8d8._M_dataplus._M_p != paVar4) {
      operator_delete(local_8d8._M_dataplus._M_p,
                      CONCAT17(local_8d8.field_2._M_local_buf[7],
                               local_8d8.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar2 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar2,0x2fca);
    local_8f8.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
    local_8f8._M_string_length = 2;
    local_8f8.field_2._M_local_buf[2] = '\0';
    local_8f8._M_dataplus._M_p = (pointer)&local_8f8.field_2;
    HttpTestListener::SetResponseBody(pHVar2,&local_8f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
      operator_delete(local_8f8._M_dataplus._M_p,
                      CONCAT17(local_8f8.field_2._M_local_buf[7],
                               CONCAT43(local_8f8.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_8f8.field_2._M_local_buf[2],
                                                 local_8f8.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    HttpTestListener::Start(pHVar2);
    std::__cxx11::string::operator=((string *)local_870,"OwnerId");
    std::__cxx11::string::operator=((string *)&local_850,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)&local_830,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_810,"ScalingGroupId");
    std::__cxx11::string::operator=((string *)&local_7f0,"ActiveScalingConfigurationId");
    std::__cxx11::string::operator=((string *)&local_7d0,"InstanceId.1");
    std::__cxx11::string::operator=((string *)&local_7b0,"InstanceId.2");
    std::__cxx11::string::operator=(local_790,"InstanceId.3");
    std::__cxx11::string::operator=(local_770,"InstanceId.4");
    std::__cxx11::string::operator=(local_750,"InstanceId.5");
    std::__cxx11::string::operator=((string *)&local_730,"InstanceId.6");
    std::__cxx11::string::operator=((string *)&local_710,"InstanceId.7");
    std::__cxx11::string::operator=((string *)&local_6f0,"InstanceId.8");
    std::__cxx11::string::operator=((string *)&local_6d0,"InstanceId.9");
    std::__cxx11::string::operator=((string *)&local_6b0,"InstanceId.10");
    std::__cxx11::string::operator=((string *)&local_690,"InstanceId.11");
    std::__cxx11::string::operator=((string *)&local_670,"InstanceId.12");
    std::__cxx11::string::operator=((string *)&local_650,"InstanceId.13");
    std::__cxx11::string::operator=((string *)&local_630,"InstanceId.14");
    std::__cxx11::string::operator=((string *)&local_610,"InstanceId.15");
    std::__cxx11::string::operator=((string *)&local_5f0,"InstanceId.16");
    std::__cxx11::string::operator=((string *)&local_5d0,"InstanceId.17");
    std::__cxx11::string::operator=((string *)&local_5b0,"InstanceId.18");
    std::__cxx11::string::operator=((string *)&local_590,"InstanceId.19");
    std::__cxx11::string::operator=((string *)&local_570,"InstanceId.20");
    std::__cxx11::string::operator=((string *)&local_550,"OwnerAccount");
    aliyun::Ess::EnableScalingGroup
              ((EssEnableScalingGroupRequestType *)this,
               (EssEnableScalingGroupResponseType *)local_870,(EssErrorInfo *)&local_918);
    HttpTestListener::WaitComplete(pHVar2);
    main_cold_18();
LAB_0010d4ab:
    local_8f8.field_2._M_allocated_capacity._0_2_ = 0x3231;
    local_8f8.field_2._M_local_buf[2] = '7';
    local_8f8.field_2._M_allocated_capacity._3_4_ = 0x302e302e;
    local_8f8.field_2._M_local_buf[7] = '.';
    local_8f8.field_2._8_7_ = 0x34333232313a31;
    local_8f8._M_string_length = 0xf;
    local_8f8.field_2._M_local_buf[0xf] = '\0';
    local_8f8._M_dataplus._M_p = (pointer)&local_8f8.field_2;
    aliyun::Ess::SetProxyHost((Ess *)this,&local_8f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
      operator_delete(local_8f8._M_dataplus._M_p,
                      CONCAT17(local_8f8.field_2._M_local_buf[7],
                               CONCAT43(local_8f8.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_8f8.field_2._M_local_buf[2],
                                                 local_8f8.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar2 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar2,0x2fca);
    local_918._M_dataplus._M_p = (pointer)&local_918.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_918,"{  \"ScalingActivityId\": \"ScalingActivityId\"}","");
    HttpTestListener::SetResponseBody(pHVar2,&local_918);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_918._M_dataplus._M_p != &local_918.field_2) {
      operator_delete(local_918._M_dataplus._M_p,local_918.field_2._M_allocated_capacity + 1);
    }
    HttpTestListener::Start(pHVar2);
    std::__cxx11::string::operator=((string *)local_870,"OwnerId");
    std::__cxx11::string::operator=((string *)&local_850,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)&local_830,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_810,"ScalingRuleAri");
    std::__cxx11::string::operator=((string *)&local_7f0,"ClientToken");
    std::__cxx11::string::operator=((string *)&local_7d0,"OwnerAccount");
    aliyun::Ess::ExecuteScalingRule
              ((EssExecuteScalingRuleRequestType *)this,
               (EssExecuteScalingRuleResponseType *)local_870,(EssErrorInfo *)local_8b8);
    HttpTestListener::WaitComplete(pHVar2);
    main_cold_19();
LAB_0010d617:
    local_8d8.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_8d8.field_2._M_local_buf[7] = '.';
    local_8d8.field_2._M_local_buf[8] = '1';
    local_8d8.field_2._M_local_buf[9] = ':';
    local_8d8.field_2._10_5_ = 0x3433323231;
    local_8d8._M_string_length = 0xf;
    local_8d8.field_2._M_local_buf[0xf] = '\0';
    local_8d8._M_dataplus._M_p = (pointer)paVar4;
    aliyun::Ess::SetProxyHost((Ess *)this,&local_8d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8d8._M_dataplus._M_p != paVar4) {
      operator_delete(local_8d8._M_dataplus._M_p,
                      CONCAT17(local_8d8.field_2._M_local_buf[7],
                               local_8d8.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar2 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar2,0x2fca);
    local_8f8.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
    local_8f8._M_string_length = 2;
    local_8f8.field_2._M_local_buf[2] = '\0';
    local_8f8._M_dataplus._M_p = (pointer)&local_8f8.field_2;
    HttpTestListener::SetResponseBody(pHVar2,&local_8f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
      operator_delete(local_8f8._M_dataplus._M_p,
                      CONCAT17(local_8f8.field_2._M_local_buf[7],
                               CONCAT43(local_8f8.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_8f8.field_2._M_local_buf[2],
                                                 local_8f8.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    HttpTestListener::Start(pHVar2);
    std::__cxx11::string::operator=((string *)local_870,"OwnerId");
    std::__cxx11::string::operator=((string *)&local_850,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)&local_830,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_810,"ScalingGroupId");
    std::__cxx11::string::operator=((string *)&local_7f0,"ScalingGroupName");
    std::__cxx11::string::operator=((string *)&local_7d0,"MinSize");
    std::__cxx11::string::operator=((string *)&local_7b0,"MaxSize");
    std::__cxx11::string::operator=(local_790,"DefaultCooldown");
    std::__cxx11::string::operator=(local_770,"RemovalPolicy.1");
    std::__cxx11::string::operator=(local_750,"RemovalPolicy.2");
    std::__cxx11::string::operator=((string *)&local_730,"ActiveScalingConfigurationId");
    std::__cxx11::string::operator=((string *)&local_710,"OwnerAccount");
    aliyun::Ess::ModifyScalingGroup
              ((EssModifyScalingGroupRequestType *)this,
               (EssModifyScalingGroupResponseType *)local_870,(EssErrorInfo *)&local_918);
    HttpTestListener::WaitComplete(pHVar2);
    main_cold_20();
LAB_0010d7f4:
    local_8d8.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_8d8.field_2._M_local_buf[7] = '.';
    local_8d8.field_2._M_local_buf[8] = '1';
    local_8d8.field_2._M_local_buf[9] = ':';
    local_8d8.field_2._10_5_ = 0x3433323231;
    local_8d8._M_string_length = 0xf;
    local_8d8.field_2._M_local_buf[0xf] = '\0';
    local_8d8._M_dataplus._M_p = (pointer)paVar4;
    aliyun::Ess::SetProxyHost((Ess *)this,&local_8d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8d8._M_dataplus._M_p != paVar4) {
      operator_delete(local_8d8._M_dataplus._M_p,
                      CONCAT17(local_8d8.field_2._M_local_buf[7],
                               local_8d8.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
    }
    pHVar2 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar2,0x2fca);
    local_8f8.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
    local_8f8._M_string_length = 2;
    local_8f8.field_2._M_local_buf[2] = '\0';
    local_8f8._M_dataplus._M_p = (pointer)&local_8f8.field_2;
    HttpTestListener::SetResponseBody(pHVar2,&local_8f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
      operator_delete(local_8f8._M_dataplus._M_p,
                      CONCAT17(local_8f8.field_2._M_local_buf[7],
                               CONCAT43(local_8f8.field_2._M_allocated_capacity._3_4_,
                                        CONCAT12(local_8f8.field_2._M_local_buf[2],
                                                 local_8f8.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    HttpTestListener::Start(pHVar2);
    std::__cxx11::string::operator=((string *)local_870,"OwnerId");
    std::__cxx11::string::operator=((string *)&local_850,"ResourceOwnerAccount");
    std::__cxx11::string::operator=((string *)&local_830,"ResourceOwnerId");
    std::__cxx11::string::operator=((string *)&local_810,"ScalingRuleId");
    std::__cxx11::string::operator=((string *)&local_7f0,"ScalingRuleName");
    std::__cxx11::string::operator=((string *)&local_7d0,"Cooldown");
    std::__cxx11::string::operator=((string *)&local_7b0,"AdjustmentType");
    std::__cxx11::string::operator=(local_790,"AdjustmentValue");
    std::__cxx11::string::operator=(local_770,"OwnerAccount");
    aliyun::Ess::ModifyScalingRule
              ((EssModifyScalingRuleRequestType *)this,(EssModifyScalingRuleResponseType *)local_870
               ,(EssErrorInfo *)&local_918);
    HttpTestListener::WaitComplete(pHVar2);
    main_cold_21();
  }
  local_8d8.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
  local_8d8.field_2._M_local_buf[7] = '.';
  local_8d8.field_2._M_local_buf[8] = '1';
  local_8d8.field_2._M_local_buf[9] = ':';
  local_8d8.field_2._10_5_ = 0x3433323231;
  local_8d8._M_string_length = 0xf;
  local_8d8.field_2._M_local_buf[0xf] = '\0';
  local_8d8._M_dataplus._M_p = (pointer)paVar4;
  aliyun::Ess::SetProxyHost((Ess *)this,&local_8d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d8._M_dataplus._M_p != paVar4) {
    operator_delete(local_8d8._M_dataplus._M_p,
                    CONCAT17(local_8d8.field_2._M_local_buf[7],
                             local_8d8.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
    *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
  }
  pHVar2 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar2,0x2fca);
  local_8f8.field_2._M_allocated_capacity._0_2_ = 0x7d7b;
  local_8f8._M_string_length = 2;
  local_8f8.field_2._M_local_buf[2] = '\0';
  local_8f8._M_dataplus._M_p = (pointer)&local_8f8.field_2;
  HttpTestListener::SetResponseBody(pHVar2,&local_8f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
    operator_delete(local_8f8._M_dataplus._M_p,
                    CONCAT17(local_8f8.field_2._M_local_buf[7],
                             CONCAT43(local_8f8.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_8f8.field_2._M_local_buf[2],
                                               local_8f8.field_2._M_allocated_capacity._0_2_))) + 1)
    ;
  }
  HttpTestListener::Start(pHVar2);
  std::__cxx11::string::operator=((string *)local_870,"OwnerId");
  std::__cxx11::string::operator=((string *)&local_850,"ResourceOwnerAccount");
  std::__cxx11::string::operator=((string *)&local_830,"ResourceOwnerId");
  std::__cxx11::string::operator=((string *)&local_810,"ScheduledTaskId");
  std::__cxx11::string::operator=((string *)&local_7f0,"ScheduledTaskName");
  std::__cxx11::string::operator=((string *)&local_7d0,"Description");
  std::__cxx11::string::operator=((string *)&local_7b0,"ScheduledAction");
  std::__cxx11::string::operator=(local_790,"RecurrenceEndTime");
  std::__cxx11::string::operator=(local_770,"LaunchTime");
  std::__cxx11::string::operator=(local_750,"RecurrenceType");
  std::__cxx11::string::operator=((string *)&local_730,"RecurrenceValue");
  std::__cxx11::string::operator=((string *)&local_710,"TaskEnabled");
  std::__cxx11::string::operator=((string *)&local_6f0,"LaunchExpirationTime");
  std::__cxx11::string::operator=((string *)&local_6d0,"OwnerAccount");
  aliyun::Ess::ModifyScheduledTask
            ((EssModifyScheduledTaskRequestType *)this,
             (EssModifyScheduledTaskResponseType *)local_870,(EssErrorInfo *)&local_918);
  HttpTestListener::WaitComplete(pHVar2);
  main_cold_22();
LAB_0010db9a:
  local_8f8.field_2._M_allocated_capacity._0_2_ = 0x3231;
  local_8f8.field_2._M_local_buf[2] = '7';
  local_8f8.field_2._M_allocated_capacity._3_4_ = 0x302e302e;
  local_8f8.field_2._M_local_buf[7] = '.';
  local_8f8.field_2._8_7_ = 0x34333232313a31;
  local_8f8._M_string_length = 0xf;
  local_8f8.field_2._M_local_buf[0xf] = '\0';
  local_8f8._M_dataplus._M_p = (pointer)&local_8f8.field_2;
  aliyun::Ess::SetProxyHost((Ess *)this,&local_8f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
    operator_delete(local_8f8._M_dataplus._M_p,
                    CONCAT17(local_8f8.field_2._M_local_buf[7],
                             CONCAT43(local_8f8.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_8f8.field_2._M_local_buf[2],
                                               local_8f8.field_2._M_allocated_capacity._0_2_))) + 1)
    ;
  }
  if ((char)(this->resource_owner_account)._M_string_length == '\x01') {
    *(undefined1 *)((long)&(this->resource_owner_account)._M_string_length + 1) = 0;
  }
  pHVar2 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar2,0x2fca);
  local_918._M_dataplus._M_p = (pointer)&local_918.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_918,"{  \"ScalingActivityId\": \"ScalingActivityId\"}","");
  HttpTestListener::SetResponseBody(pHVar2,&local_918);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_918._M_dataplus._M_p != &local_918.field_2) {
    operator_delete(local_918._M_dataplus._M_p,local_918.field_2._M_allocated_capacity + 1);
  }
  HttpTestListener::Start(pHVar2);
  std::__cxx11::string::operator=((string *)local_870,"OwnerId");
  std::__cxx11::string::operator=((string *)&local_850,"ResourceOwnerAccount");
  std::__cxx11::string::operator=((string *)&local_830,"ResourceOwnerId");
  std::__cxx11::string::operator=((string *)&local_810,"ScalingGroupId");
  std::__cxx11::string::operator=((string *)&local_7f0,"InstanceId.1");
  std::__cxx11::string::operator=((string *)&local_7d0,"InstanceId.2");
  std::__cxx11::string::operator=((string *)&local_7b0,"InstanceId.3");
  std::__cxx11::string::operator=(local_790,"InstanceId.4");
  std::__cxx11::string::operator=(local_770,"InstanceId.5");
  std::__cxx11::string::operator=(local_750,"InstanceId.6");
  std::__cxx11::string::operator=((string *)&local_730,"InstanceId.7");
  std::__cxx11::string::operator=((string *)&local_710,"InstanceId.8");
  std::__cxx11::string::operator=((string *)&local_6f0,"InstanceId.9");
  std::__cxx11::string::operator=((string *)&local_6d0,"InstanceId.10");
  std::__cxx11::string::operator=((string *)&local_6b0,"InstanceId.11");
  std::__cxx11::string::operator=((string *)&local_690,"InstanceId.12");
  std::__cxx11::string::operator=((string *)&local_670,"InstanceId.13");
  std::__cxx11::string::operator=((string *)&local_650,"InstanceId.14");
  std::__cxx11::string::operator=((string *)&local_630,"InstanceId.15");
  std::__cxx11::string::operator=((string *)&local_610,"InstanceId.16");
  std::__cxx11::string::operator=((string *)&local_5f0,"InstanceId.17");
  std::__cxx11::string::operator=((string *)&local_5d0,"InstanceId.18");
  std::__cxx11::string::operator=((string *)&local_5b0,"InstanceId.19");
  std::__cxx11::string::operator=((string *)&local_590,"InstanceId.20");
  std::__cxx11::string::operator=((string *)&local_570,"OwnerAccount");
  aliyun::Ess::RemoveInstances
            ((EssRemoveInstancesRequestType *)this,(EssRemoveInstancesResponseType *)local_870,
             (EssErrorInfo *)local_8b8);
  HttpTestListener::WaitComplete(pHVar2);
  main_cold_23();
  std::
  vector<aliyun::EssDescribeScheduledTasksScheduledTaskType,_std::allocator<aliyun::EssDescribeScheduledTasksScheduledTaskType>_>
  ::~vector((vector<aliyun::EssDescribeScheduledTasksScheduledTaskType,_std::allocator<aliyun::EssDescribeScheduledTasksScheduledTaskType>_>
             *)local_8b8);
  aliyun::EssDescribeScheduledTasksRequestType::~EssDescribeScheduledTasksRequestType
            ((EssDescribeScheduledTasksRequestType *)local_870);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main() {
  test_attach_instances();
  test_create_scaling_configuration();
  test_create_scaling_group();
  test_create_scaling_rule();
  test_create_scheduled_task();
  test_delete_scaling_configuration();
  test_delete_scaling_group();
  test_delete_scaling_rule();
  test_delete_scheduled_task();
  test_describe_scaling_activities();
  test_describe_scaling_configurations();
  test_describe_scaling_groups();
  test_describe_scaling_instances();
  test_describe_scaling_rules();
  test_describe_scheduled_tasks();
  test_detach_instances();
  test_disable_scaling_group();
  test_enable_scaling_group();
  test_execute_scaling_rule();
  test_modify_scaling_group();
  test_modify_scaling_rule();
  test_modify_scheduled_task();
  test_remove_instances();
}